

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enter.hpp
# Opt level: O1

bool __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::enter(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        *this,SPxId *enterId,bool polish)

{
  double a;
  fpclass_type fVar1;
  SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar2;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar3;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar4;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar5;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar6;
  SLinSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar7;
  int *piVar8;
  pointer pnVar9;
  DataKey DVar10;
  undefined8 uVar11;
  int32_t iVar16;
  Item *pIVar12;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pUVar13;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pVVar14;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar15;
  LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pLVar17;
  int32_t iVar18;
  DataKey *pDVar19;
  bool bVar20;
  int iVar21;
  uint uVar22;
  undefined4 extraout_var;
  SPxOut *pSVar23;
  _func_int **pp_Var24;
  cpp_dec_float<200U,_int,_void> *pcVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  undefined7 in_register_00000011;
  ulong uVar29;
  ulong uVar30;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pUVar31;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar32;
  pointer pnVar33;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar34;
  cpp_dec_float<200U,_int,_void> *pcVar35;
  cpp_dec_float<200u,int,void> *pcVar36;
  uint *puVar37;
  undefined4 *puVar38;
  cpp_dec_float<200U,_int,_void> *pcVar39;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar40;
  pointer pUVar41;
  long in_FS_OFFSET;
  bool bVar42;
  byte bVar43;
  Real RVar44;
  Status enterStat;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_f98;
  DataKey *local_f90;
  ulong local_f88;
  uint local_f7c;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  SPxId none;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  leavebound;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_11;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  enterVal;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  enterTest;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  enterMax;
  undefined1 local_ba8 [16];
  undefined1 local_b98 [16];
  undefined1 local_b88 [16];
  undefined1 local_b78 [16];
  undefined1 local_b68 [16];
  undefined1 local_b58 [16];
  undefined1 local_b48 [13];
  undefined3 uStack_b3b;
  int iStack_b38;
  undefined1 uStack_b34;
  undefined8 local_b30;
  undefined1 local_b28 [32];
  undefined1 local_b08 [16];
  undefined1 local_af8 [16];
  undefined1 local_ae8 [16];
  undefined1 local_ad8 [16];
  undefined1 local_ac8 [13];
  undefined3 uStack_abb;
  int iStack_ab8;
  bool bStack_ab4;
  undefined8 local_ab0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  enterLB;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  enterUB;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_16;
  undefined8 local_928;
  undefined8 uStack_920;
  undefined8 local_918;
  undefined8 uStack_910;
  undefined8 local_908;
  undefined8 uStack_900;
  undefined8 local_8f8;
  undefined8 uStack_8f0;
  undefined8 local_8e8;
  undefined8 uStack_8e0;
  undefined8 local_8d8;
  undefined8 uStack_8d0;
  undefined8 local_8c8;
  undefined5 uStack_8c0;
  undefined3 uStack_8bb;
  int iStack_8b8;
  byte bStack_8b4;
  undefined8 local_8b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  enterRO;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_828;
  uint local_7a8 [28];
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_17;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_6b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_630;
  uint local_5b0 [28];
  int local_540;
  undefined1 local_53c;
  fpclass_type local_538;
  int32_t iStack_534;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_530;
  uint local_4b0 [28];
  int local_440;
  undefined1 local_43c;
  fpclass_type local_438;
  int32_t iStack_434;
  uint local_430 [28];
  int local_3c0;
  undefined1 local_3bc;
  fpclass_type local_3b8;
  int32_t iStack_3b4;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_3b0 [2];
  uint local_2b0 [28];
  int local_240;
  undefined1 local_23c;
  fpclass_type local_238;
  int32_t iStack_234;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_230;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1b0;
  uint local_130 [28];
  int local_c0;
  undefined1 local_bc;
  fpclass_type local_b8;
  int32_t iStack_b4;
  uint local_b0 [28];
  int local_40;
  undefined1 local_3c;
  fpclass_type local_38;
  int32_t iStack_34;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *rhs;
  
  bVar43 = 0;
  uVar22 = (uint)CONCAT71(in_register_00000011,polish);
  none.super_DataKey.info = 0;
  none.super_DataKey.idx = -1;
  enterTest.m_backend.fpclass = cpp_dec_float_finite;
  enterTest.m_backend.prec_elem = 0x1c;
  enterTest.m_backend.data._M_elems[0] = 0;
  enterTest.m_backend.data._M_elems[1] = 0;
  enterTest.m_backend.data._M_elems[2] = 0;
  enterTest.m_backend.data._M_elems[3] = 0;
  enterTest.m_backend.data._M_elems[4] = 0;
  enterTest.m_backend.data._M_elems[5] = 0;
  enterTest.m_backend.data._M_elems[6] = 0;
  enterTest.m_backend.data._M_elems[7] = 0;
  enterTest.m_backend.data._M_elems[8] = 0;
  enterTest.m_backend.data._M_elems[9] = 0;
  enterTest.m_backend.data._M_elems[10] = 0;
  enterTest.m_backend.data._M_elems[0xb] = 0;
  enterTest.m_backend.data._M_elems[0xc] = 0;
  enterTest.m_backend.data._M_elems[0xd] = 0;
  enterTest.m_backend.data._M_elems[0xe] = 0;
  enterTest.m_backend.data._M_elems[0xf] = 0;
  enterTest.m_backend.data._M_elems[0x10] = 0;
  enterTest.m_backend.data._M_elems[0x11] = 0;
  enterTest.m_backend.data._M_elems[0x12] = 0;
  enterTest.m_backend.data._M_elems[0x13] = 0;
  enterTest.m_backend.data._M_elems[0x14] = 0;
  enterTest.m_backend.data._M_elems[0x15] = 0;
  enterTest.m_backend.data._M_elems[0x16] = 0;
  enterTest.m_backend.data._M_elems[0x17] = 0;
  enterTest.m_backend.data._M_elems._96_13_ = SUB1613((undefined1  [16])0x0,0);
  enterTest.m_backend.data._M_elems[0x1b]._1_3_ = 0;
  enterTest.m_backend.exp = 0;
  enterTest.m_backend.neg = false;
  enterUB.m_backend.fpclass = cpp_dec_float_finite;
  enterUB.m_backend.prec_elem = 0x1c;
  enterUB.m_backend.data._M_elems[0] = 0;
  enterUB.m_backend.data._M_elems[1] = 0;
  enterUB.m_backend.data._M_elems[2] = 0;
  enterUB.m_backend.data._M_elems[3] = 0;
  enterUB.m_backend.data._M_elems[4] = 0;
  enterUB.m_backend.data._M_elems[5] = 0;
  enterUB.m_backend.data._M_elems[6] = 0;
  enterUB.m_backend.data._M_elems[7] = 0;
  enterUB.m_backend.data._M_elems[8] = 0;
  enterUB.m_backend.data._M_elems[9] = 0;
  enterUB.m_backend.data._M_elems[10] = 0;
  enterUB.m_backend.data._M_elems[0xb] = 0;
  enterUB.m_backend.data._M_elems[0xc] = 0;
  enterUB.m_backend.data._M_elems[0xd] = 0;
  enterUB.m_backend.data._M_elems[0xe] = 0;
  enterUB.m_backend.data._M_elems[0xf] = 0;
  enterUB.m_backend.data._M_elems[0x10] = 0;
  enterUB.m_backend.data._M_elems[0x11] = 0;
  enterUB.m_backend.data._M_elems[0x12] = 0;
  enterUB.m_backend.data._M_elems[0x13] = 0;
  enterUB.m_backend.data._M_elems[0x14] = 0;
  enterUB.m_backend.data._M_elems[0x15] = 0;
  enterUB.m_backend.data._M_elems[0x16] = 0;
  enterUB.m_backend.data._M_elems[0x17] = 0;
  enterUB.m_backend.data._M_elems._96_13_ = SUB1613((undefined1  [16])0x0,0);
  enterUB.m_backend.data._M_elems[0x1b]._1_3_ = 0;
  enterUB.m_backend.exp = 0;
  enterUB.m_backend.neg = false;
  enterLB.m_backend.fpclass = cpp_dec_float_finite;
  enterLB.m_backend.prec_elem = 0x1c;
  enterLB.m_backend.data._M_elems[0] = 0;
  enterLB.m_backend.data._M_elems[1] = 0;
  enterLB.m_backend.data._M_elems[2] = 0;
  enterLB.m_backend.data._M_elems[3] = 0;
  enterLB.m_backend.data._M_elems[4] = 0;
  enterLB.m_backend.data._M_elems[5] = 0;
  enterLB.m_backend.data._M_elems[6] = 0;
  enterLB.m_backend.data._M_elems[7] = 0;
  enterLB.m_backend.data._M_elems[8] = 0;
  enterLB.m_backend.data._M_elems[9] = 0;
  enterLB.m_backend.data._M_elems[10] = 0;
  enterLB.m_backend.data._M_elems[0xb] = 0;
  enterLB.m_backend.data._M_elems[0xc] = 0;
  enterLB.m_backend.data._M_elems[0xd] = 0;
  enterLB.m_backend.data._M_elems[0xe] = 0;
  enterLB.m_backend.data._M_elems[0xf] = 0;
  enterLB.m_backend.data._M_elems[0x10] = 0;
  enterLB.m_backend.data._M_elems[0x11] = 0;
  enterLB.m_backend.data._M_elems[0x12] = 0;
  enterLB.m_backend.data._M_elems[0x13] = 0;
  enterLB.m_backend.data._M_elems[0x14] = 0;
  enterLB.m_backend.data._M_elems[0x15] = 0;
  enterLB.m_backend.data._M_elems[0x16] = 0;
  enterLB.m_backend.data._M_elems[0x17] = 0;
  enterLB.m_backend.data._M_elems._96_13_ = SUB1613((undefined1  [16])0x0,0);
  enterLB.m_backend.data._M_elems[0x1b]._1_3_ = 0;
  enterLB.m_backend.exp = 0;
  enterLB.m_backend.neg = false;
  enterVal.m_backend.fpclass = cpp_dec_float_finite;
  enterVal.m_backend.prec_elem = 0x1c;
  enterVal.m_backend.data._M_elems[0] = 0;
  enterVal.m_backend.data._M_elems[1] = 0;
  enterVal.m_backend.data._M_elems[2] = 0;
  enterVal.m_backend.data._M_elems[3] = 0;
  enterVal.m_backend.data._M_elems[4] = 0;
  enterVal.m_backend.data._M_elems[5] = 0;
  enterVal.m_backend.data._M_elems[6] = 0;
  enterVal.m_backend.data._M_elems[7] = 0;
  enterVal.m_backend.data._M_elems[8] = 0;
  enterVal.m_backend.data._M_elems[9] = 0;
  enterVal.m_backend.data._M_elems[10] = 0;
  enterVal.m_backend.data._M_elems[0xb] = 0;
  enterVal.m_backend.data._M_elems[0xc] = 0;
  enterVal.m_backend.data._M_elems[0xd] = 0;
  enterVal.m_backend.data._M_elems[0xe] = 0;
  enterVal.m_backend.data._M_elems[0xf] = 0;
  enterVal.m_backend.data._M_elems[0x10] = 0;
  enterVal.m_backend.data._M_elems[0x11] = 0;
  enterVal.m_backend.data._M_elems[0x12] = 0;
  enterVal.m_backend.data._M_elems[0x13] = 0;
  enterVal.m_backend.data._M_elems[0x14] = 0;
  enterVal.m_backend.data._M_elems[0x15] = 0;
  enterVal.m_backend.data._M_elems[0x16] = 0;
  enterVal.m_backend.data._M_elems[0x17] = 0;
  enterVal.m_backend.data._M_elems._96_13_ = SUB1613((undefined1  [16])0x0,0);
  enterVal.m_backend.data._M_elems[0x1b]._1_3_ = 0;
  enterVal.m_backend.exp = 0;
  enterVal.m_backend.neg = false;
  enterMax.m_backend.fpclass = cpp_dec_float_finite;
  enterMax.m_backend.prec_elem = 0x1c;
  enterMax.m_backend.data._M_elems[0] = 0;
  enterMax.m_backend.data._M_elems[1] = 0;
  enterMax.m_backend.data._M_elems[2] = 0;
  enterMax.m_backend.data._M_elems[3] = 0;
  enterMax.m_backend.data._M_elems[4] = 0;
  enterMax.m_backend.data._M_elems[5] = 0;
  enterMax.m_backend.data._M_elems[6] = 0;
  enterMax.m_backend.data._M_elems[7] = 0;
  enterMax.m_backend.data._M_elems[8] = 0;
  enterMax.m_backend.data._M_elems[9] = 0;
  enterMax.m_backend.data._M_elems[10] = 0;
  enterMax.m_backend.data._M_elems[0xb] = 0;
  enterMax.m_backend.data._M_elems[0xc] = 0;
  enterMax.m_backend.data._M_elems[0xd] = 0;
  enterMax.m_backend.data._M_elems[0xe] = 0;
  enterMax.m_backend.data._M_elems[0xf] = 0;
  enterMax.m_backend.data._M_elems[0x10] = 0;
  enterMax.m_backend.data._M_elems[0x11] = 0;
  enterMax.m_backend.data._M_elems[0x12] = 0;
  enterMax.m_backend.data._M_elems[0x13] = 0;
  enterMax.m_backend.data._M_elems[0x14] = 0;
  enterMax.m_backend.data._M_elems[0x15] = 0;
  enterMax.m_backend.data._M_elems[0x16] = 0;
  enterMax.m_backend.data._M_elems[0x17] = 0;
  enterMax.m_backend.data._M_elems._96_13_ = SUB1613((undefined1  [16])0x0,0);
  enterMax.m_backend.data._M_elems[0x1b]._1_3_ = 0;
  enterMax.m_backend.exp = 0;
  enterMax.m_backend.neg = false;
  local_ab0._0_4_ = cpp_dec_float_finite;
  local_ab0._4_4_ = 0x1c;
  local_b28._0_16_ = (undefined1  [16])0x0;
  local_b28._16_16_ = (undefined1  [16])0x0;
  local_b08 = (undefined1  [16])0x0;
  local_af8 = (undefined1  [16])0x0;
  local_ae8 = (undefined1  [16])0x0;
  local_ad8 = (undefined1  [16])0x0;
  local_ac8 = SUB1613((undefined1  [16])0x0,0);
  uStack_abb = 0;
  iStack_ab8 = 0;
  bStack_ab4 = false;
  enterRO.m_backend.fpclass = cpp_dec_float_finite;
  enterRO.m_backend.prec_elem = 0x1c;
  enterRO.m_backend.data._M_elems[0] = 0;
  enterRO.m_backend.data._M_elems[1] = 0;
  enterRO.m_backend.data._M_elems[2] = 0;
  enterRO.m_backend.data._M_elems[3] = 0;
  enterRO.m_backend.data._M_elems[4] = 0;
  enterRO.m_backend.data._M_elems[5] = 0;
  enterRO.m_backend.data._M_elems[6] = 0;
  enterRO.m_backend.data._M_elems[7] = 0;
  enterRO.m_backend.data._M_elems[8] = 0;
  enterRO.m_backend.data._M_elems[9] = 0;
  enterRO.m_backend.data._M_elems[10] = 0;
  enterRO.m_backend.data._M_elems[0xb] = 0;
  enterRO.m_backend.data._M_elems[0xc] = 0;
  enterRO.m_backend.data._M_elems[0xd] = 0;
  enterRO.m_backend.data._M_elems[0xe] = 0;
  enterRO.m_backend.data._M_elems[0xf] = 0;
  enterRO.m_backend.data._M_elems[0x10] = 0;
  enterRO.m_backend.data._M_elems[0x11] = 0;
  enterRO.m_backend.data._M_elems[0x12] = 0;
  enterRO.m_backend.data._M_elems[0x13] = 0;
  enterRO.m_backend.data._M_elems[0x14] = 0;
  enterRO.m_backend.data._M_elems[0x15] = 0;
  enterRO.m_backend.data._M_elems[0x16] = 0;
  enterRO.m_backend.data._M_elems[0x17] = 0;
  enterRO.m_backend.data._M_elems._96_13_ = SUB1613((undefined1  [16])0x0,0);
  enterRO.m_backend.data._M_elems[0x1b]._1_3_ = 0;
  enterRO.m_backend.exp = 0;
  enterRO.m_backend.neg = false;
  local_b30._0_4_ = cpp_dec_float_finite;
  local_b30._4_4_ = 0x1c;
  local_ba8 = (undefined1  [16])0x0;
  local_b98 = (undefined1  [16])0x0;
  local_b88 = (undefined1  [16])0x0;
  local_b78 = (undefined1  [16])0x0;
  local_b68 = (undefined1  [16])0x0;
  local_b58 = (undefined1  [16])0x0;
  local_b48 = SUB1613((undefined1  [16])0x0,0);
  uStack_b3b = 0;
  iStack_b38 = 0;
  uStack_b34 = 0;
  iVar21 = (*(this->
             super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .
             super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .
             super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._vptr_ClassArray[0x7e])();
  rhs = (SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         *)CONCAT44(extraout_var,iVar21);
  local_f88 = CONCAT71(local_f88._1_7_,this->instableEnter);
  local_f98 = this;
  local_f90 = &enterId->super_DataKey;
  (*(this->
    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).
    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ._vptr_ClassArray[0x81])
            (this,enterId->super_DataKey,&enterTest,&enterUB,&enterLB,&enterVal,&enterMax,local_b28,
             &enterStat,&enterRO,local_ba8);
  pSVar32 = local_f98;
  if (uVar22 == 0) {
    RVar44 = Tolerances::epsilon((local_f98->
                                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 )._tolerances.
                                 super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr);
    result_1.m_backend.fpclass = cpp_dec_float_finite;
    result_1.m_backend.prec_elem = 0x1c;
    result_1.m_backend.data._M_elems[0] = 0;
    result_1.m_backend.data._M_elems[1] = 0;
    result_1.m_backend.data._M_elems[2] = 0;
    result_1.m_backend.data._M_elems[3] = 0;
    result_1.m_backend.data._M_elems[4] = 0;
    result_1.m_backend.data._M_elems[5] = 0;
    result_1.m_backend.data._M_elems[6] = 0;
    result_1.m_backend.data._M_elems[7] = 0;
    result_1.m_backend.data._M_elems[8] = 0;
    result_1.m_backend.data._M_elems[9] = 0;
    result_1.m_backend.data._M_elems[10] = 0;
    result_1.m_backend.data._M_elems[0xb] = 0;
    result_1.m_backend.data._M_elems[0xc] = 0;
    result_1.m_backend.data._M_elems[0xd] = 0;
    result_1.m_backend.data._M_elems[0xe] = 0;
    result_1.m_backend.data._M_elems[0xf] = 0;
    result_1.m_backend.data._M_elems[0x10] = 0;
    result_1.m_backend.data._M_elems[0x11] = 0;
    result_1.m_backend.data._M_elems[0x12] = 0;
    result_1.m_backend.data._M_elems[0x13] = 0;
    result_1.m_backend.data._M_elems[0x14] = 0;
    result_1.m_backend.data._M_elems[0x15] = 0;
    result_1.m_backend.data._M_elems[0x16] = 0;
    result_1.m_backend.data._M_elems[0x17] = 0;
    result_1.m_backend.data._M_elems[0x18] = 0;
    result_1.m_backend.data._M_elems[0x19] = 0;
    result_1.m_backend.data._M_elems._104_5_ = 0;
    result_1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
    result_1.m_backend.exp = 0;
    result_1.m_backend.neg = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&result_1,RVar44);
    pcVar36 = (cpp_dec_float<200u,int,void> *)&result_1;
    pnVar34 = &result;
    for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
      (pnVar34->m_backend).data._M_elems[0] = *(uint *)pcVar36;
      pcVar36 = pcVar36 + (ulong)bVar43 * -8 + 4;
      pnVar34 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar34 + ((ulong)bVar43 * -2 + 1) * 4);
    }
    result.m_backend.exp = result_1.m_backend.exp;
    result.m_backend.neg = result_1.m_backend.neg;
    result.m_backend.fpclass = result_1.m_backend.fpclass;
    result.m_backend.prec_elem = result_1.m_backend.prec_elem;
    if (result.m_backend.data._M_elems[0] != 0 || result_1.m_backend.fpclass != cpp_dec_float_finite
       ) {
      result.m_backend.neg = (bool)(result_1.m_backend.neg ^ 1);
    }
    if (((result_1.m_backend.fpclass != cpp_dec_float_NaN) &&
        (enterTest.m_backend.fpclass != cpp_dec_float_NaN)) &&
       (iVar21 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                           (&enterTest.m_backend,&result.m_backend), 0 < iVar21)) {
      DVar10 = *local_f90;
      pnVar34 = &enterTest;
      puVar37 = local_b0;
      for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
        *puVar37 = (pnVar34->m_backend).data._M_elems[0];
        pnVar34 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar34 + ((ulong)bVar43 * -2 + 1) * 4);
        puVar37 = puVar37 + (ulong)bVar43 * -2 + 1;
      }
      local_40 = enterTest.m_backend.exp;
      local_3c = enterTest.m_backend.neg;
      local_38 = enterTest.m_backend.fpclass;
      iStack_34 = enterTest.m_backend.prec_elem;
      (*(pSVar32->
        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[0x84])(pSVar32,DVar10,local_b0,(ulong)(uint)enterStat);
      pp_Var24 = (pSVar32->
                 super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 )._vptr_SPxBasisBase;
      bVar42 = false;
      goto LAB_005138ff;
    }
  }
  pUVar31 = pSVar32->theFvec;
  if (((pUVar31->thedelta).setupStatus == true) && ((pUVar31->thedelta).super_IdxSet.num == 0)) {
    SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::solve4update(&pSVar32->
                    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ,&pUVar31->thedelta,rhs);
  }
  if ((!polish) && (pSVar32->m_maxCycle < pSVar32->m_numCycle)) {
    pnVar34 = &enterMax;
    pnVar40 = &result_1;
    for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
      (pnVar40->m_backend).data._M_elems[0] = (pnVar34->m_backend).data._M_elems[0];
      pnVar34 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar34 + ((ulong)bVar43 * -2 + 1) * 4);
      pnVar40 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar40 + ((ulong)bVar43 * -2 + 1) * 4);
    }
    result_1.m_backend.exp = enterMax.m_backend.exp;
    result_1.m_backend.neg = enterMax.m_backend.neg;
    result_1.m_backend.fpclass = enterMax.m_backend.fpclass;
    result_1.m_backend.prec_elem = enterMax.m_backend.prec_elem;
    if (result_1.m_backend.data._M_elems[0] != 0 ||
        enterMax.m_backend.fpclass != cpp_dec_float_finite) {
      result_1.m_backend.neg = (bool)(enterMax.m_backend.neg ^ 1);
    }
    if (enterMax.m_backend.fpclass == cpp_dec_float_NaN) {
LAB_00512e9e:
      lVar26 = 0x448;
    }
    else {
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
                (&result.m_backend,0,(type *)0x0);
      iVar21 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                         (&result_1.m_backend,&result.m_backend);
      lVar26 = 0x450;
      if (iVar21 < 1) goto LAB_00512e9e;
    }
    (**(code **)((long)(pSVar32->
                       super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .
                       super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .
                       super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._vptr_ClassArray + lVar26))(pSVar32);
  }
  pnVar34 = &enterMax;
  pnVar40 = &result_1;
  for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
    (pnVar40->m_backend).data._M_elems[0] = (pnVar34->m_backend).data._M_elems[0];
    pnVar34 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar34 + ((ulong)bVar43 * -2 + 1) * 4);
    pnVar40 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar40 + ((ulong)bVar43 * -2 + 1) * 4);
  }
  result_1.m_backend.exp = enterMax.m_backend.exp;
  result_1.m_backend.neg = enterMax.m_backend.neg;
  result_1.m_backend.fpclass = enterMax.m_backend.fpclass;
  result_1.m_backend.prec_elem = enterMax.m_backend.prec_elem;
  if (enterMax.m_backend.fpclass != cpp_dec_float_finite || result_1.m_backend.data._M_elems[0] != 0
     ) {
    result_1.m_backend.neg = (bool)(enterMax.m_backend.neg ^ 1);
  }
  pSVar32->boundflips = 0;
  pSVar2 = pSVar32->theratiotester;
  pnVar34 = &enterTest;
  puVar37 = local_130;
  for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
    *puVar37 = (pnVar34->m_backend).data._M_elems[0];
    pnVar34 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar34 + ((ulong)bVar43 * -2 + 1) * 4);
    puVar37 = puVar37 + (ulong)bVar43 * -2 + 1;
  }
  local_c0 = enterTest.m_backend.exp;
  local_bc = enterTest.m_backend.neg;
  local_b8 = enterTest.m_backend.fpclass;
  iStack_b4 = enterTest.m_backend.prec_elem;
  uVar22 = (*pSVar2->_vptr_SPxRatioTester[7])(pSVar2,&result_1,local_130,(ulong)(uVar22 & 0xff));
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
            (&(pSVar32->instableEnterVal).m_backend,0);
  (pSVar32->instableEnterId).super_DataKey = (DataKey)0xffffffff00000000;
  pSVar32->instableEnter = false;
  bVar42 = -1 < (int)uVar22;
  local_f7c = uVar22;
  if (!bVar42) {
    pnVar34 = &result_1;
    pnVar40 = &local_828;
    for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
      (pnVar40->m_backend).data._M_elems[0] = (pnVar34->m_backend).data._M_elems[0];
      pnVar34 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar34 + ((ulong)bVar43 * -2 + 1) * 4);
      pnVar40 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar40 + ((ulong)bVar43 * -2 + 1) * 4);
    }
    local_828.m_backend.exp = result_1.m_backend.exp;
    local_828.m_backend.neg = result_1.m_backend.neg;
    local_828.m_backend.fpclass = result_1.m_backend.fpclass;
    local_828.m_backend.prec_elem = result_1.m_backend.prec_elem;
    pnVar34 = &enterMax;
    pnVar40 = &result_16;
    for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
      (pnVar40->m_backend).data._M_elems[0] = (pnVar34->m_backend).data._M_elems[0];
      pnVar34 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar34 + ((ulong)bVar43 * -2 + 1) * 4);
      pnVar40 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar40 + ((ulong)bVar43 * -2 + 1) * 4);
    }
    result_16.m_backend.exp = enterMax.m_backend.exp;
    result_16.m_backend.neg = enterMax.m_backend.neg;
    result_16.m_backend.fpclass = enterMax.m_backend.fpclass;
    result_16.m_backend.prec_elem = enterMax.m_backend.prec_elem;
    if (enterMax.m_backend.fpclass != cpp_dec_float_finite ||
        result_16.m_backend.data._M_elems[0] != 0) {
      result_16.m_backend.neg = (bool)(enterMax.m_backend.neg ^ 1);
    }
    RVar44 = Tolerances::epsilon((pSVar32->
                                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 )._tolerances.
                                 super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr);
    bVar20 = NE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                       (&local_828,&result_16,RVar44);
    if (!bVar20) {
      if (!polish) {
        ::soplex::infinity::__tls_init();
        a = *(double *)(in_FS_OFFSET + -8);
        result.m_backend.fpclass = cpp_dec_float_finite;
        result.m_backend.prec_elem = 0x1c;
        result.m_backend.data._M_elems._0_16_ = ZEXT816(0);
        result.m_backend.data._M_elems._16_16_ = ZEXT816(0);
        result.m_backend.data._M_elems._32_16_ = ZEXT816(0);
        result.m_backend.data._M_elems._48_16_ = ZEXT816(0);
        result.m_backend.data._M_elems._64_16_ = ZEXT816(0);
        result.m_backend.data._M_elems._80_16_ = ZEXT816(0);
        result.m_backend.data._M_elems[0x18] = 0;
        result.m_backend.data._M_elems[0x19] = 0;
        result.m_backend.data._M_elems._104_5_ = 0;
        result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
        result.m_backend.exp = 0;
        result.m_backend.neg = false;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)&result,a);
        if (((result_1.m_backend.fpclass != cpp_dec_float_NaN) &&
            (result.m_backend.fpclass != cpp_dec_float_NaN)) &&
           (iVar21 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                               (&result_1.m_backend,&result.m_backend), iVar21 < 0)) {
          ::soplex::infinity::__tls_init();
          leavebound.m_backend.fpclass = cpp_dec_float_finite;
          leavebound.m_backend.prec_elem = 0x1c;
          leavebound.m_backend.data._M_elems._0_16_ = ZEXT816(0);
          leavebound.m_backend.data._M_elems._16_16_ = ZEXT816(0);
          leavebound.m_backend.data._M_elems._32_16_ = ZEXT816(0);
          leavebound.m_backend.data._M_elems._48_16_ = ZEXT816(0);
          leavebound.m_backend.data._M_elems._64_16_ = ZEXT816(0);
          leavebound.m_backend.data._M_elems._80_16_ = ZEXT816(0);
          leavebound.m_backend.data._M_elems[0x18] = 0;
          leavebound.m_backend.data._M_elems[0x19] = 0;
          leavebound.m_backend.data._M_elems._104_5_ = 0;
          leavebound.m_backend.data._M_elems[0x1b]._1_3_ = 0;
          leavebound.m_backend.exp = 0;
          leavebound.m_backend.neg = false;
          boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                    ((cpp_dec_float<200u,int,void> *)&leavebound,
                     (double)((ulong)a ^ (ulong)DAT_00601010));
          if (((result_1.m_backend.fpclass != cpp_dec_float_NaN) &&
              (leavebound.m_backend.fpclass != cpp_dec_float_NaN)) &&
             (iVar21 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                 (&result_1.m_backend,&leavebound.m_backend), pDVar19 = local_f90,
             0 < iVar21)) {
            (**(pSVar32->
               super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               )._vptr_SPxBasisBase)
                      (&pSVar32->
                        super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ,0xffffffff,local_f90,rhs,0);
            pUVar31 = pSVar32->theFvec;
            pnVar34 = &result_1;
            pnVar40 = &pUVar31->theval;
            for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
              (pnVar40->m_backend).data._M_elems[0] = (pnVar34->m_backend).data._M_elems[0];
              pnVar34 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar34 + ((ulong)bVar43 * -2 + 1) * 4);
              pnVar40 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar40 + (ulong)bVar43 * -8 + 4);
            }
            (pUVar31->theval).m_backend.exp = result_1.m_backend.exp;
            (pUVar31->theval).m_backend.neg = result_1.m_backend.neg;
            (pUVar31->theval).m_backend.fpclass = result_1.m_backend.fpclass;
            (pUVar31->theval).m_backend.prec_elem = result_1.m_backend.prec_elem;
            pUVar31 = pSVar32->theFvec;
            VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
            ::
            multAdd<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      ((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        *)pUVar31,&pUVar31->theval,&pUVar31->thedelta);
            DVar10 = *pDVar19;
            pnVar34 = &result_1;
            puVar37 = local_4b0;
            for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
              *puVar37 = (pnVar34->m_backend).data._M_elems[0];
              pnVar34 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar34 + ((ulong)bVar43 * -2 + 1) * 4);
              puVar37 = puVar37 + (ulong)bVar43 * -2 + 1;
            }
            local_440 = result_1.m_backend.exp;
            local_43c = result_1.m_backend.neg;
            local_438 = result_1.m_backend.fpclass;
            iStack_434 = result_1.m_backend.prec_elem;
            (*(pSVar32->
              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .
              super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._vptr_ClassArray[0x83])
                      (pSVar32,DVar10,(ulong)(uint)enterStat,local_4b0,rhs,local_ba8);
            puVar37 = (uint *)local_ba8;
            pnVar34 = &local_530;
            for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
              (pnVar34->m_backend).data._M_elems[0] = *puVar37;
              puVar37 = puVar37 + (ulong)bVar43 * -2 + 1;
              pnVar34 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar34 + ((ulong)bVar43 * -2 + 1) * 4);
            }
            local_530.m_backend.exp = iStack_b38;
            local_530.m_backend.neg = (bool)uStack_b34;
            local_530.m_backend.fpclass = (fpclass_type)local_b30;
            local_530.m_backend.prec_elem = local_b30._4_4_;
            updateNonbasicValue(pSVar32,&local_530);
            return bVar42;
          }
        }
      }
      DVar10 = *local_f90;
      pnVar34 = &enterTest;
      puVar37 = local_5b0;
      for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
        *puVar37 = (pnVar34->m_backend).data._M_elems[0];
        pnVar34 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar34 + ((ulong)bVar43 * -2 + 1) * 4);
        puVar37 = puVar37 + (ulong)bVar43 * -2 + 1;
      }
      local_540 = enterTest.m_backend.exp;
      local_53c = enterTest.m_backend.neg;
      local_538 = enterTest.m_backend.fpclass;
      iStack_534 = enterTest.m_backend.prec_elem;
      (*(pSVar32->
        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[0x84])(pSVar32,DVar10,local_5b0,(ulong)(uint)enterStat);
      (**(pSVar32->
         super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         )._vptr_SPxBasisBase)
                (&pSVar32->
                  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ,0xffffffff,&none,0,0);
      if (polish) {
        return bVar42;
      }
      if (1 < (pSVar32->
              super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).updateCount) {
        pSVar23 = pSVar32->spxout;
        if ((pSVar23 != (SPxOut *)0x0) && (4 < (int)pSVar23->m_verbosity)) {
          result.m_backend.data._M_elems[0] = pSVar23->m_verbosity;
          leavebound.m_backend.data._M_elems[0] = 5;
          (*pSVar23->_vptr_SPxOut[2])();
          pSVar23 = soplex::operator<<(pSVar32->spxout,"IENTER01 factorization triggered in ");
          pSVar23 = soplex::operator<<(pSVar23,"enter() for feasibility test");
          std::endl<char,std::char_traits<char>>(pSVar23->m_streams[pSVar23->m_verbosity]);
          (*pSVar32->spxout->_vptr_SPxOut[2])(pSVar32->spxout,&result);
        }
        (*(pSVar32->
          super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._vptr_ClassArray[0x75])(pSVar32);
        return bVar42;
      }
      pnVar34 = &enterTest;
      pnVar40 = &result;
      for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
        (pnVar40->m_backend).data._M_elems[0] = (pnVar34->m_backend).data._M_elems[0];
        pnVar34 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar34 + ((ulong)bVar43 * -2 + 1) * 4);
        pnVar40 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar40 + ((ulong)bVar43 * -2 + 1) * 4);
      }
      result.m_backend.exp = enterTest.m_backend.exp;
      result.m_backend.neg = enterTest.m_backend.neg;
      result.m_backend.fpclass = enterTest.m_backend.fpclass;
      result.m_backend.prec_elem = enterTest.m_backend.prec_elem;
      if ((enterTest.m_backend.neg == true) &&
         (enterTest.m_backend.fpclass != cpp_dec_float_finite ||
          result.m_backend.data._M_elems[0] != 0)) {
        result.m_backend.neg = false;
      }
      entertol(&leavebound,pSVar32);
      if (((result.m_backend.fpclass != cpp_dec_float_NaN) &&
          (leavebound.m_backend.fpclass != cpp_dec_float_NaN)) &&
         (iVar21 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                             (&result.m_backend,&leavebound.m_backend), iVar21 < 0)) {
        pSVar23 = pSVar32->spxout;
        if ((pSVar23 != (SPxOut *)0x0) && (4 < (int)pSVar23->m_verbosity)) {
          result.m_backend.data._M_elems[0] = pSVar23->m_verbosity;
          leavebound.m_backend.data._M_elems[0] = 5;
          (*pSVar23->_vptr_SPxOut[2])();
          pSVar23 = soplex::operator<<(pSVar32->spxout,
                                       "IENTER11 clean up step to reduce numerical errors");
          std::endl<char,std::char_traits<char>>(pSVar23->m_streams[pSVar23->m_verbosity]);
          (*pSVar32->spxout->_vptr_SPxOut[2])(pSVar32->spxout,&result);
        }
        SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::coSolve(&pSVar32->
                   super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ,&pSVar32->theCoPvec->
                    super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ,pSVar32->theCoPrhs);
        computePvec(pSVar32);
        computeCoTest(pSVar32);
        computeTest(pSVar32);
        return bVar42;
      }
      pSVar23 = pSVar32->spxout;
      if ((pSVar23 != (SPxOut *)0x0) && (4 < (int)pSVar23->m_verbosity)) {
        result.m_backend.data._M_elems[0] = pSVar23->m_verbosity;
        leavebound.m_backend.data._M_elems[0] = 5;
        (*pSVar23->_vptr_SPxOut[2])();
        pSVar23 = soplex::operator<<(pSVar32->spxout,
                                     "IENTER02 unboundedness/infeasibility found in ");
        pSVar23 = soplex::operator<<(pSVar23,"enter()");
        std::endl<char,std::char_traits<char>>(pSVar23->m_streams[pSVar23->m_verbosity]);
        (*pSVar32->spxout->_vptr_SPxOut[2])(pSVar32->spxout,&result);
      }
      if (pSVar32->theRep == ROW) {
        pnVar34 = &result_1;
        pnVar40 = &local_630;
        for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
          (pnVar40->m_backend).data._M_elems[0] = (pnVar34->m_backend).data._M_elems[0];
          pnVar34 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar34 + ((ulong)bVar43 * -2 + 1) * 4);
          pnVar40 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar40 + ((ulong)bVar43 * -2 + 1) * 4);
        }
        local_630.m_backend.exp = result_1.m_backend.exp;
        local_630.m_backend.neg = result_1.m_backend.neg;
        local_630.m_backend.fpclass = result_1.m_backend.fpclass;
        local_630.m_backend.prec_elem = result_1.m_backend.prec_elem;
        computeDualfarkas4Row(pSVar32,&local_630,(SPxId)*local_f90);
        if (pSVar32->m_status == OPTIMAL) {
          pSVar32->m_status = UNKNOWN;
        }
        if ((pSVar32->
            super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).thestatus == INFEASIBLE) {
          return bVar42;
        }
        (pSVar32->
        super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).thestatus = INFEASIBLE;
        return bVar42;
      }
      pnVar34 = &result_1;
      pnVar40 = &local_6b0;
      for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
        (pnVar40->m_backend).data._M_elems[0] = (pnVar34->m_backend).data._M_elems[0];
        pnVar34 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar34 + ((ulong)bVar43 * -2 + 1) * 4);
        pnVar40 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar40 + ((ulong)bVar43 * -2 + 1) * 4);
      }
      local_6b0.m_backend.exp = result_1.m_backend.exp;
      local_6b0.m_backend.neg = result_1.m_backend.neg;
      local_6b0.m_backend.fpclass = result_1.m_backend.fpclass;
      local_6b0.m_backend.prec_elem = result_1.m_backend.prec_elem;
      computePrimalray4Col(pSVar32,&local_6b0,(SPxId)*local_f90);
      if (pSVar32->m_status == OPTIMAL) {
        pSVar32->m_status = UNKNOWN;
      }
      if ((pSVar32->
          super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).thestatus == UNBOUNDED) {
        return bVar42;
      }
      (pSVar32->
      super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).thestatus = UNBOUNDED;
      return bVar42;
    }
    DVar10 = *local_f90;
    if ((char)local_f88 == '\0') {
      (pSVar32->instableEnterId).super_DataKey = DVar10;
      pcVar35 = &enterTest.m_backend;
      pnVar34 = &pSVar32->instableEnterVal;
      for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
        (pnVar34->m_backend).data._M_elems[0] = (pcVar35->data)._M_elems[0];
        pcVar35 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar35 + (ulong)bVar43 * -8 + 4);
        pnVar34 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar34 + (ulong)bVar43 * -8 + 4);
      }
      (pSVar32->instableEnterVal).m_backend.exp = enterTest.m_backend.exp;
      (pSVar32->instableEnterVal).m_backend.neg = enterTest.m_backend.neg;
      (pSVar32->instableEnterVal).m_backend.fpclass = enterTest.m_backend.fpclass;
      (pSVar32->instableEnterVal).m_backend.prec_elem = enterTest.m_backend.prec_elem;
      DVar10 = *local_f90;
      result_17.m_backend.fpclass = cpp_dec_float_finite;
      result_17.m_backend.prec_elem = 0x1c;
      result_17.m_backend.data._M_elems[0] = 0;
      result_17.m_backend.data._M_elems[1] = 0;
      result_17.m_backend.data._M_elems[2] = 0;
      result_17.m_backend.data._M_elems[3] = 0;
      result_17.m_backend.data._M_elems[4] = 0;
      result_17.m_backend.data._M_elems[5] = 0;
      result_17.m_backend.data._M_elems[6] = 0;
      result_17.m_backend.data._M_elems[7] = 0;
      result_17.m_backend.data._M_elems[8] = 0;
      result_17.m_backend.data._M_elems[9] = 0;
      result_17.m_backend.data._M_elems[10] = 0;
      result_17.m_backend.data._M_elems[0xb] = 0;
      result_17.m_backend.data._M_elems[0xc] = 0;
      result_17.m_backend.data._M_elems[0xd] = 0;
      result_17.m_backend.data._M_elems[0xe] = 0;
      result_17.m_backend.data._M_elems[0xf] = 0;
      result_17.m_backend.data._M_elems[0x10] = 0;
      result_17.m_backend.data._M_elems[0x11] = 0;
      result_17.m_backend.data._M_elems[0x12] = 0;
      result_17.m_backend.data._M_elems[0x13] = 0;
      result_17.m_backend.data._M_elems[0x14] = 0;
      result_17.m_backend.data._M_elems[0x15] = 0;
      result_17.m_backend.data._M_elems[0x16] = 0;
      result_17.m_backend.data._M_elems[0x17] = 0;
      result_17.m_backend.data._M_elems._96_13_ = SUB1613((undefined1  [16])0x0,0);
      result_17.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      result_17.m_backend.exp = 0;
      result_17.m_backend.neg = false;
      result.m_backend.fpclass = cpp_dec_float_finite;
      result.m_backend.prec_elem = 0x1c;
      result.m_backend.data._M_elems[0] = 0;
      result.m_backend.data._M_elems[1] = 0;
      result.m_backend.data._M_elems[2] = 0;
      result.m_backend.data._M_elems[3] = 0;
      result.m_backend.data._M_elems[4] = 0;
      result.m_backend.data._M_elems[5] = 0;
      result.m_backend.data._M_elems[6] = 0;
      result.m_backend.data._M_elems[7] = 0;
      result.m_backend.data._M_elems[8] = 0;
      result.m_backend.data._M_elems[9] = 0;
      result.m_backend.data._M_elems[10] = 0;
      result.m_backend.data._M_elems[0xb] = 0;
      result.m_backend.data._M_elems[0xc] = 0;
      result.m_backend.data._M_elems[0xd] = 0;
      result.m_backend.data._M_elems[0xe] = 0;
      result.m_backend.data._M_elems[0xf] = 0;
      result.m_backend.data._M_elems[0x10] = 0;
      result.m_backend.data._M_elems[0x11] = 0;
      result.m_backend.data._M_elems[0x12] = 0;
      result.m_backend.data._M_elems[0x13] = 0;
      result.m_backend.data._M_elems[0x14] = 0;
      result.m_backend.data._M_elems[0x15] = 0;
      result.m_backend.data._M_elems[0x16] = 0;
      result.m_backend.data._M_elems[0x17] = 0;
      result.m_backend.data._M_elems[0x18] = 0;
      result.m_backend.data._M_elems[0x19] = 0;
      result.m_backend.data._M_elems._104_5_ = 0;
      result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      result.m_backend.exp = 0;
      result.m_backend.neg = false;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)&result.m_backend,10.0);
      boost::multiprecision::default_ops::
      eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                (&result_17.m_backend,&enterTest.m_backend,&result.m_backend);
      (*(pSVar32->
        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[0x84])(pSVar32,DVar10,&result_17.m_backend,(ulong)(uint)enterStat);
    }
    else {
      pnVar34 = &enterTest;
      puVar37 = local_430;
      for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
        *puVar37 = (pnVar34->m_backend).data._M_elems[0];
        pnVar34 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar34 + ((ulong)bVar43 * -2 + 1) * 4);
        puVar37 = puVar37 + (ulong)bVar43 * -2 + 1;
      }
      local_3c0 = enterTest.m_backend.exp;
      local_3bc = enterTest.m_backend.neg;
      local_3b8 = enterTest.m_backend.fpclass;
      iStack_3b4 = enterTest.m_backend.prec_elem;
      (*(pSVar32->
        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[0x84])(pSVar32,DVar10,local_430,(ulong)(uint)enterStat);
    }
    pp_Var24 = (pSVar32->
               super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               )._vptr_SPxBasisBase;
LAB_005138ff:
    (**pp_Var24)(&pSVar32->
                  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ,0xffffffff,&none,0,0);
    return bVar42;
  }
  pnVar34 = &result_1;
  pcVar35 = &result.m_backend;
  for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
    (pcVar35->data)._M_elems[0] = (pnVar34->m_backend).data._M_elems[0];
    pnVar34 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar34 + ((ulong)bVar43 * -2 + 1) * 4);
    pcVar35 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar35 + (ulong)bVar43 * -8 + 4);
  }
  result.m_backend.exp = result_1.m_backend.exp;
  result.m_backend.neg = result_1.m_backend.neg;
  result.m_backend.fpclass = result_1.m_backend.fpclass;
  result.m_backend.prec_elem = result_1.m_backend.prec_elem;
  if ((result_1.m_backend.neg == true) &&
     (result_1.m_backend.fpclass != cpp_dec_float_finite || result.m_backend.data._M_elems[0] != 0))
  {
    result.m_backend.neg = false;
  }
  entertol(&leavebound,pSVar32);
  local_f88 = (ulong)local_f7c;
  if (((result.m_backend.fpclass == cpp_dec_float_NaN) ||
      (leavebound.m_backend.fpclass == cpp_dec_float_NaN)) ||
     (iVar21 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                         (&result.m_backend,&leavebound.m_backend), -1 < iVar21)) {
    pSVar32->m_numCycle = pSVar32->m_numCycle / 2;
  }
  else {
    pnVar9 = (pSVar32->theUBbound).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pnVar33 = pnVar9 + local_f88;
    pnVar34 = &local_1b0;
    for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
      (pnVar34->m_backend).data._M_elems[0] = (pnVar33->m_backend).data._M_elems[0];
      pnVar33 = (pointer)((long)pnVar33 + ((ulong)bVar43 * -2 + 1) * 4);
      pnVar34 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar34 + ((ulong)bVar43 * -2 + 1) * 4);
    }
    local_1b0.m_backend.exp = pnVar9[local_f88].m_backend.exp;
    local_1b0.m_backend.neg = pnVar9[local_f88].m_backend.neg;
    local_1b0.m_backend.fpclass = pnVar9[local_f88].m_backend.fpclass;
    local_1b0.m_backend.prec_elem = pnVar9[local_f88].m_backend.prec_elem;
    pnVar9 = (pSVar32->theLBbound).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pnVar33 = pnVar9 + local_f88;
    pnVar34 = &local_230;
    for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
      (pnVar34->m_backend).data._M_elems[0] = (pnVar33->m_backend).data._M_elems[0];
      pnVar33 = (pointer)((long)pnVar33 + ((ulong)bVar43 * -2 + 1) * 4);
      pnVar34 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar34 + ((ulong)bVar43 * -2 + 1) * 4);
    }
    local_230.m_backend.exp = pnVar9[local_f88].m_backend.exp;
    local_230.m_backend.neg = pnVar9[local_f88].m_backend.neg;
    local_230.m_backend.fpclass = pnVar9[local_f88].m_backend.fpclass;
    local_230.m_backend.prec_elem = pnVar9[local_f88].m_backend.prec_elem;
    RVar44 = Tolerances::epsilon((pSVar32->
                                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 )._tolerances.
                                 super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr);
    bVar20 = NE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                       (&local_1b0,&local_230,RVar44);
    if (((bVar20) && (enterStat != P_FREE)) && (enterStat != D_FREE)) {
      pSVar32->m_numCycle = pSVar32->m_numCycle + 1;
      pSVar32->enterCycles = pSVar32->enterCycles + 1;
    }
  }
  pSVar3 = pSVar32->coSolveVector3;
  if (pSVar3 == (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)0x0) {
LAB_00513622:
    pSVar3 = pSVar32->coSolveVector2;
    if (pSVar3 == (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)0x0) {
      SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::coSolve(&pSVar32->
                 super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ,&pSVar32->theCoPvec->thedelta,
                &(pSVar32->unitVecs).data.
                 super__Vector_base<soplex::UnitVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::UnitVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[local_f88].
                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               );
    }
    else {
      pUVar31 = pSVar32->theCoPvec;
      pSVar4 = pSVar32->coSolveVector2rhs;
      pUVar41 = (pSVar32->unitVecs).data.
                super__Vector_base<soplex::UnitVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::UnitVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + local_f88;
      if ((pSVar32->
          super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).factorized == false) {
        SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::factorize(&pSVar32->
                     super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   );
      }
      pSVar7 = (pSVar32->
               super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).factor;
      (*pSVar7->_vptr_SLinSolver[0x18])(pSVar7,&pUVar31->thedelta,pSVar3,pUVar41,pSVar4);
    }
  }
  else {
    pSVar4 = pSVar32->coSolveVector2;
    if (pSVar4 == (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)0x0) {
      if (pSVar3 == (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)0x0) goto LAB_00513622;
      pUVar31 = pSVar32->theCoPvec;
      pSVar4 = pSVar32->coSolveVector3rhs;
      pUVar41 = (pSVar32->unitVecs).data.
                super__Vector_base<soplex::UnitVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::UnitVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + local_f88;
      if ((pSVar32->
          super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).factorized == false) {
        SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::factorize(&pSVar32->
                     super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   );
      }
      pSVar7 = (pSVar32->
               super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).factor;
      (*pSVar7->_vptr_SLinSolver[0x18])(pSVar7,&pUVar31->thedelta,pSVar3,pUVar41,pSVar4);
      pSVar3 = pSVar32->coSolveVector3;
      pUVar31 = pSVar32->theCoPvec;
      if (pSVar3->setupStatus == true) {
        lVar26 = (long)(pSVar3->super_IdxSet).num;
        if (0 < lVar26) {
          lVar26 = lVar26 + 1;
          do {
            piVar8 = (pSVar3->super_IdxSet).idx;
            pnVar9 = (pSVar3->
                     super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            iVar21 = piVar8[lVar26 + -2];
            pnVar33 = pnVar9 + iVar21;
            pcVar35 = &result.m_backend;
            for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
              (pcVar35->data)._M_elems[0] = (pnVar33->m_backend).data._M_elems[0];
              pnVar33 = (pointer)((long)pnVar33 + ((ulong)bVar43 * -2 + 1) * 4);
              pcVar35 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar35 + (ulong)bVar43 * -8 + 4);
            }
            result.m_backend.exp = pnVar9[iVar21].m_backend.exp;
            result.m_backend.neg = pnVar9[iVar21].m_backend.neg;
            result.m_backend.fpclass = pnVar9[iVar21].m_backend.fpclass;
            result.m_backend.prec_elem = pnVar9[iVar21].m_backend.prec_elem;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                      (&(pUVar31->
                        super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[piVar8[lVar26 + -2]].m_backend,
                       &result.m_backend);
            lVar26 = lVar26 + -1;
          } while (1 < lVar26);
        }
      }
      else {
        uVar22 = (uint)((ulong)((long)(pUVar31->
                                      super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      ).val.
                                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(pUVar31->
                                     super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                     ).val.
                                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 7);
        if (0 < (int)uVar22) {
          uVar29 = (ulong)(uVar22 & 0x7fffffff);
          lVar26 = uVar29 + 1;
          lVar27 = uVar29 << 7;
          do {
            pnVar9 = (pSVar3->
                     super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            puVar37 = (uint *)((long)pnVar9[-1].m_backend.data._M_elems + lVar27);
            pcVar35 = &result.m_backend;
            for (lVar28 = 0x1c; lVar28 != 0; lVar28 = lVar28 + -1) {
              (pcVar35->data)._M_elems[0] = *puVar37;
              puVar37 = puVar37 + (ulong)bVar43 * -2 + 1;
              pcVar35 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar35 + (ulong)bVar43 * -8 + 4);
            }
            result.m_backend.exp = *(int *)((long)(&pnVar9[-1].m_backend.data + 1) + lVar27);
            result.m_backend.neg = *(bool *)((long)(&pnVar9[-1].m_backend.data + 1) + lVar27 + 4U);
            result.m_backend._120_8_ =
                 *(undefined8 *)((long)(&pnVar9[-1].m_backend.data + 1) + lVar27 + 8U);
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                      ((cpp_dec_float<200U,_int,_void> *)
                       ((long)(pUVar31->
                              super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ).val.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[0xffffffffffffffff].
                              m_backend.data._M_elems + lVar27),&result.m_backend);
            lVar26 = lVar26 + -1;
            lVar27 = lVar27 + -0x80;
          } while (1 < lVar26);
        }
      }
    }
    else {
      pUVar31 = pSVar32->theCoPvec;
      pSVar5 = pSVar32->coSolveVector2rhs;
      pSVar6 = pSVar32->coSolveVector3rhs;
      pUVar41 = (pSVar32->unitVecs).data.
                super__Vector_base<soplex::UnitVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::UnitVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + local_f88;
      if ((pSVar32->
          super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).factorized == false) {
        SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::factorize(&pSVar32->
                     super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   );
      }
      pSVar7 = (pSVar32->
               super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).factor;
      (*pSVar7->_vptr_SLinSolver[0x1a])
                (pSVar7,&pUVar31->thedelta,pSVar4,pSVar3,pUVar41,pSVar5,pSVar6);
      pSVar3 = pSVar32->coSolveVector3;
      pUVar31 = pSVar32->theCoPvec;
      if (pSVar3->setupStatus == true) {
        lVar26 = (long)(pSVar3->super_IdxSet).num;
        if (0 < lVar26) {
          lVar26 = lVar26 + 1;
          do {
            piVar8 = (pSVar3->super_IdxSet).idx;
            pnVar9 = (pSVar3->
                     super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            iVar21 = piVar8[lVar26 + -2];
            pnVar33 = pnVar9 + iVar21;
            pcVar35 = &result.m_backend;
            for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
              (pcVar35->data)._M_elems[0] = (pnVar33->m_backend).data._M_elems[0];
              pnVar33 = (pointer)((long)pnVar33 + ((ulong)bVar43 * -2 + 1) * 4);
              pcVar35 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar35 + (ulong)bVar43 * -8 + 4);
            }
            result.m_backend.exp = pnVar9[iVar21].m_backend.exp;
            result.m_backend.neg = pnVar9[iVar21].m_backend.neg;
            result.m_backend.fpclass = pnVar9[iVar21].m_backend.fpclass;
            result.m_backend.prec_elem = pnVar9[iVar21].m_backend.prec_elem;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                      (&(pUVar31->
                        super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[piVar8[lVar26 + -2]].m_backend,
                       &result.m_backend);
            lVar26 = lVar26 + -1;
          } while (1 < lVar26);
        }
      }
      else {
        uVar22 = (uint)((ulong)((long)(pUVar31->
                                      super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      ).val.
                                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(pUVar31->
                                     super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                     ).val.
                                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 7);
        if (0 < (int)uVar22) {
          uVar29 = (ulong)(uVar22 & 0x7fffffff);
          lVar26 = uVar29 + 1;
          lVar27 = uVar29 << 7;
          do {
            pnVar9 = (pSVar3->
                     super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            puVar37 = (uint *)((long)pnVar9[-1].m_backend.data._M_elems + lVar27);
            pcVar35 = &result.m_backend;
            for (lVar28 = 0x1c; lVar28 != 0; lVar28 = lVar28 + -1) {
              (pcVar35->data)._M_elems[0] = *puVar37;
              puVar37 = puVar37 + (ulong)bVar43 * -2 + 1;
              pcVar35 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar35 + (ulong)bVar43 * -8 + 4);
            }
            result.m_backend.exp = *(int *)((long)(&pnVar9[-1].m_backend.data + 1) + lVar27);
            result.m_backend.neg = *(bool *)((long)(&pnVar9[-1].m_backend.data + 1) + lVar27 + 4U);
            result.m_backend._120_8_ =
                 *(undefined8 *)((long)(&pnVar9[-1].m_backend.data + 1) + lVar27 + 8U);
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                      ((cpp_dec_float<200U,_int,_void> *)
                       ((long)(pUVar31->
                              super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ).val.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[0xffffffffffffffff].
                              m_backend.data._M_elems + lVar27),&result.m_backend);
            lVar26 = lVar26 + -1;
            lVar27 = lVar27 + -0x80;
          } while (1 < lVar26);
        }
      }
    }
  }
  pSVar32 = local_f98;
  if (0 < local_f98->boundflips) {
    uVar22 = (uint)((ulong)((long)(local_f98->coSolveVector3->
                                  super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  ).val.
                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(local_f98->coSolveVector3->
                                 super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 ).val.
                                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 7);
    if (0 < (int)uVar22) {
      uVar29 = (ulong)(uVar22 & 0x7fffffff);
      do {
        uVar30 = uVar29 - 1;
        pnVar9 = (pSVar32->coSolveVector3->
                 super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pnVar33 = pnVar9 + uVar30;
        puVar37 = local_7a8;
        for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
          *puVar37 = (pnVar33->m_backend).data._M_elems[0];
          pnVar33 = (pointer)((long)pnVar33 + ((ulong)bVar43 * -2 + 1) * 4);
          puVar37 = puVar37 + (ulong)bVar43 * -2 + 1;
        }
        iVar21 = pnVar9[uVar30].m_backend.exp;
        bVar20 = pnVar9[uVar30].m_backend.neg;
        uVar11._0_4_ = pnVar9[uVar30].m_backend.fpclass;
        uVar11._4_4_ = pnVar9[uVar30].m_backend.prec_elem;
        result.m_backend.fpclass = cpp_dec_float_finite;
        result.m_backend.prec_elem = 0x1c;
        result.m_backend.neg = false;
        result.m_backend.exp = 0;
        puVar37 = local_7a8;
        pcVar35 = &result.m_backend;
        for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
          (pcVar35->data)._M_elems[0] = *puVar37;
          puVar37 = puVar37 + (ulong)bVar43 * -2 + 1;
          pcVar35 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar35 + (ulong)bVar43 * -8 + 4);
        }
        result.m_backend.neg = bVar20;
        if ((bVar20 == true) &&
           ((fpclass_type)uVar11 != cpp_dec_float_finite || result.m_backend.data._M_elems[0] != 0))
        {
          result.m_backend.neg = false;
        }
        result.m_backend.exp = iVar21;
        result.m_backend._120_8_ = uVar11;
        RVar44 = Tolerances::epsilon((pSVar32->
                                     super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                     )._tolerances.
                                     super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr);
        leavebound.m_backend.fpclass = cpp_dec_float_finite;
        leavebound.m_backend.prec_elem = 0x1c;
        leavebound.m_backend.data._M_elems._0_16_ = ZEXT816(0);
        leavebound.m_backend.data._M_elems._16_16_ = ZEXT816(0);
        leavebound.m_backend.data._M_elems._32_16_ = ZEXT816(0);
        leavebound.m_backend.data._M_elems._48_16_ = ZEXT816(0);
        leavebound.m_backend.data._M_elems._64_16_ = ZEXT816(0);
        leavebound.m_backend.data._M_elems._80_16_ = ZEXT816(0);
        leavebound.m_backend.data._M_elems[0x18] = 0;
        leavebound.m_backend.data._M_elems[0x19] = 0;
        leavebound.m_backend.data._M_elems._104_5_ = 0;
        leavebound.m_backend.data._M_elems[0x1b]._1_3_ = 0;
        leavebound.m_backend.exp = 0;
        leavebound.m_backend.neg = false;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)&leavebound,RVar44);
        if (((result.m_backend.fpclass != cpp_dec_float_NaN) &&
            (leavebound.m_backend.fpclass != cpp_dec_float_NaN)) &&
           (iVar21 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                               (&result.m_backend,&leavebound.m_backend), 0 < iVar21)) {
          pUVar31 = pSVar32->thePvec;
          pnVar9 = (pSVar32->coSolveVector3->
                   super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          iVar21 = pnVar9[uVar30].m_backend.exp;
          bVar20 = pnVar9[uVar30].m_backend.neg;
          fVar1 = pnVar9[uVar30].m_backend.fpclass;
          iVar16 = pnVar9[uVar30].m_backend.prec_elem;
          memmove(&leavebound,pnVar9 + uVar30,0x70);
          leavebound.m_backend.exp = iVar21;
          leavebound.m_backend.neg = bVar20;
          leavebound.m_backend.fpclass = fVar1;
          leavebound.m_backend.prec_elem = iVar16;
          if (fVar1 != cpp_dec_float_finite || leavebound.m_backend.data._M_elems[0] != 0) {
            leavebound.m_backend.neg = (bool)(bVar20 ^ 1);
          }
          pIVar12 = (local_f98->thecovectors->set).theitem;
          iVar21 = (local_f98->thecovectors->set).thekey[uVar30].idx;
          lVar26 = (long)pIVar12[iVar21].data.
                         super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .memused;
          pSVar32 = local_f98;
          if (0 < lVar26) {
            pIVar12 = pIVar12 + iVar21;
            lVar27 = lVar26 + 1;
            lVar26 = lVar26 * 0x84;
            do {
              pcVar25 = (cpp_dec_float<200U,_int,_void> *)
                        ((long)(pIVar12->data).
                               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               .m_elem[-1].val.m_backend.data._M_elems + lVar26);
              result.m_backend.fpclass = cpp_dec_float_finite;
              result.m_backend.prec_elem = 0x1c;
              result.m_backend.data._M_elems[0] = 0;
              result.m_backend.data._M_elems[1] = 0;
              result.m_backend.data._M_elems[2] = 0;
              result.m_backend.data._M_elems[3] = 0;
              result.m_backend.data._M_elems[4] = 0;
              result.m_backend.data._M_elems[5] = 0;
              result.m_backend.data._M_elems[6] = 0;
              result.m_backend.data._M_elems[7] = 0;
              result.m_backend.data._M_elems[8] = 0;
              result.m_backend.data._M_elems[9] = 0;
              result.m_backend.data._M_elems[10] = 0;
              result.m_backend.data._M_elems[0xb] = 0;
              result.m_backend.data._M_elems[0xc] = 0;
              result.m_backend.data._M_elems[0xd] = 0;
              result.m_backend.data._M_elems[0xe] = 0;
              result.m_backend.data._M_elems[0xf] = 0;
              result.m_backend.data._M_elems[0x10] = 0;
              result.m_backend.data._M_elems[0x11] = 0;
              result.m_backend.data._M_elems[0x12] = 0;
              result.m_backend.data._M_elems[0x13] = 0;
              result.m_backend.data._M_elems[0x14] = 0;
              result.m_backend.data._M_elems[0x15] = 0;
              result.m_backend.data._M_elems[0x16] = 0;
              result.m_backend.data._M_elems[0x17] = 0;
              result.m_backend.data._M_elems[0x18] = 0;
              result.m_backend.data._M_elems[0x19] = 0;
              result.m_backend.data._M_elems._104_5_ = 0;
              result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
              result.m_backend.exp = 0;
              result.m_backend.neg = false;
              pcVar35 = &leavebound.m_backend;
              if (pcVar25 != &result.m_backend) {
                pcVar39 = &result.m_backend;
                for (lVar28 = 0x1c; lVar28 != 0; lVar28 = lVar28 + -1) {
                  (pcVar39->data)._M_elems[0] =
                       (((cpp_dec_float<200U,_int,_void> *)&pcVar35->data)->data)._M_elems[0];
                  pcVar35 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar35 + (ulong)bVar43 * -8 + 4);
                  pcVar39 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar39 + (ulong)bVar43 * -8 + 4);
                }
                result.m_backend.exp = leavebound.m_backend.exp;
                result.m_backend.neg = leavebound.m_backend.neg;
                result.m_backend.fpclass = leavebound.m_backend.fpclass;
                result.m_backend.prec_elem = leavebound.m_backend.prec_elem;
                pcVar35 = pcVar25;
              }
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                        (&result.m_backend,pcVar35);
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                        (&(pUVar31->
                          super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start
                          [*(int *)((long)(&(pIVar12->data).
                                            super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                            .m_elem[-1].val + 1) + lVar26)].m_backend,
                         &result.m_backend);
              lVar27 = lVar27 + -1;
              pSVar32 = local_f98;
              lVar26 = lVar26 + -0x84;
            } while (1 < lVar27);
          }
        }
        bVar20 = 1 < (long)uVar29;
        uVar29 = uVar30;
      } while (bVar20);
    }
    if (local_f90->info < 1) {
      pUVar31 = pSVar32->thePvec;
      SPxRowId::SPxRowId((SPxRowId *)&result,(SPxId *)local_f90);
      pLVar17 = &(pSVar32->
                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ;
    }
    else {
      pUVar31 = pSVar32->theCoPvec;
      SPxColId::SPxColId((SPxColId *)&result,(SPxId *)local_f90);
      pLVar17 = (LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)&(pSVar32->
                    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).
                    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ;
    }
    iVar21 = ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
             ::number(&(pLVar17->
                       super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).set,(DataKey *)&result);
    pnVar9 = (pUVar31->
             super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pnVar33 = pnVar9 + iVar21;
    puVar38 = (undefined4 *)local_b28;
    for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
      *puVar38 = *(undefined4 *)&pnVar33->m_backend;
      pnVar33 = (pointer)((long)pnVar33 + ((ulong)bVar43 * -2 + 1) * 4);
      puVar38 = puVar38 + (ulong)bVar43 * -2 + 1;
    }
    iStack_ab8 = pnVar9[iVar21].m_backend.exp;
    bStack_ab4 = pnVar9[iVar21].m_backend.neg;
    local_ab0._0_4_ = pnVar9[iVar21].m_backend.fpclass;
    local_ab0._4_4_ = pnVar9[iVar21].m_backend.prec_elem;
    pSVar32->totalboundflips = pSVar32->totalboundflips + pSVar32->boundflips;
  }
  uVar29 = local_f88;
  pnVar9 = (pSVar32->theCoPrhs->val).
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pnVar34 = &enterRO;
  pnVar33 = pnVar9 + local_f88;
  for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
    (pnVar33->m_backend).data._M_elems[0] = (pnVar34->m_backend).data._M_elems[0];
    pnVar34 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar34 + ((ulong)bVar43 * -2 + 1) * 4);
    pnVar33 = (pointer)((long)pnVar33 + ((ulong)bVar43 * -2 + 1) * 4);
  }
  pnVar9[local_f88].m_backend.exp = enterRO.m_backend.exp;
  pnVar9[local_f88].m_backend.neg = enterRO.m_backend.neg;
  pnVar9[local_f88].m_backend.fpclass = enterRO.m_backend.fpclass;
  pnVar9[local_f88].m_backend.prec_elem = enterRO.m_backend.prec_elem;
  leavebound.m_backend.fpclass = cpp_dec_float_finite;
  leavebound.m_backend.prec_elem = 0x1c;
  leavebound.m_backend.exp = 0;
  leavebound.m_backend.neg = false;
  pnVar34 = &enterRO;
  pcVar35 = &leavebound.m_backend;
  for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
    (pcVar35->data)._M_elems[0] = (pnVar34->m_backend).data._M_elems[0];
    pnVar34 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar34 + ((ulong)bVar43 * -2 + 1) * 4);
    pcVar35 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar35 + (ulong)bVar43 * -8 + 4);
  }
  leavebound.m_backend.exp = enterRO.m_backend.exp;
  leavebound.m_backend.neg = enterRO.m_backend.neg;
  leavebound.m_backend.fpclass = enterRO.m_backend.fpclass;
  leavebound.m_backend.prec_elem = enterRO.m_backend.prec_elem;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
            (&leavebound.m_backend,(cpp_dec_float<200U,_int,_void> *)local_b28);
  pnVar9 = (pSVar32->theFvec->thedelta).
           super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pnVar33 = pnVar9 + uVar29;
  pcVar35 = &result_11.m_backend;
  for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
    (pcVar35->data)._M_elems[0] = (pnVar33->m_backend).data._M_elems[0];
    pnVar33 = (pointer)((long)pnVar33 + ((ulong)bVar43 * -2 + 1) * 4);
    pcVar35 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar35 + (ulong)bVar43 * -8 + 4);
  }
  result_11.m_backend.exp = pnVar9[uVar29].m_backend.exp;
  result_11.m_backend.neg = pnVar9[uVar29].m_backend.neg;
  result_11.m_backend.fpclass = pnVar9[uVar29].m_backend.fpclass;
  result_11.m_backend.prec_elem = pnVar9[uVar29].m_backend.prec_elem;
  result.m_backend.fpclass = cpp_dec_float_finite;
  result.m_backend.prec_elem = 0x1c;
  result.m_backend.data._M_elems[0] = 0;
  result.m_backend.data._M_elems[1] = 0;
  result.m_backend.data._M_elems[2] = 0;
  result.m_backend.data._M_elems[3] = 0;
  result.m_backend.data._M_elems[4] = 0;
  result.m_backend.data._M_elems[5] = 0;
  result.m_backend.data._M_elems[6] = 0;
  result.m_backend.data._M_elems[7] = 0;
  result.m_backend.data._M_elems[8] = 0;
  result.m_backend.data._M_elems[9] = 0;
  result.m_backend.data._M_elems[10] = 0;
  result.m_backend.data._M_elems[0xb] = 0;
  result.m_backend.data._M_elems[0xc] = 0;
  result.m_backend.data._M_elems[0xd] = 0;
  result.m_backend.data._M_elems[0xe] = 0;
  result.m_backend.data._M_elems[0xf] = 0;
  result.m_backend.data._M_elems[0x10] = 0;
  result.m_backend.data._M_elems[0x11] = 0;
  result.m_backend.data._M_elems[0x12] = 0;
  result.m_backend.data._M_elems[0x13] = 0;
  result.m_backend.data._M_elems[0x14] = 0;
  result.m_backend.data._M_elems[0x15] = 0;
  result.m_backend.data._M_elems[0x16] = 0;
  result.m_backend.data._M_elems[0x17] = 0;
  result.m_backend.data._M_elems[0x18] = 0;
  result.m_backend.data._M_elems[0x19] = 0;
  result.m_backend.data._M_elems._104_5_ = 0;
  result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
  result.m_backend.exp = 0;
  result.m_backend.neg = false;
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
            (&result.m_backend,&leavebound.m_backend,&result_11.m_backend);
  pUVar31 = pSVar32->theCoPvec;
  pcVar35 = &result.m_backend;
  pnVar34 = &pUVar31->theval;
  for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
    (pnVar34->m_backend).data._M_elems[0] = (pcVar35->data)._M_elems[0];
    pcVar35 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar35 + (ulong)bVar43 * -8 + 4);
    pnVar34 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar34 + (ulong)bVar43 * -8 + 4);
  }
  (pUVar31->theval).m_backend.exp = result.m_backend.exp;
  (pUVar31->theval).m_backend.neg = result.m_backend.neg;
  (pUVar31->theval).m_backend.fpclass = result.m_backend.fpclass;
  (pUVar31->theval).m_backend.prec_elem = result.m_backend.prec_elem;
  pUVar31 = pSVar32->theCoPvec;
  RVar44 = Tolerances::epsilon((pSVar32->
                               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               )._tolerances.
                               super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr);
  result.m_backend.fpclass = cpp_dec_float_finite;
  result.m_backend.prec_elem = 0x1c;
  result.m_backend.data._M_elems._0_16_ = ZEXT816(0);
  result.m_backend.data._M_elems._16_16_ = ZEXT816(0);
  result.m_backend.data._M_elems._32_16_ = ZEXT816(0);
  result.m_backend.data._M_elems._48_16_ = ZEXT816(0);
  result.m_backend.data._M_elems._64_16_ = ZEXT816(0);
  result.m_backend.data._M_elems._80_16_ = ZEXT816(0);
  result.m_backend.data._M_elems[0x18] = 0;
  result.m_backend.data._M_elems[0x19] = 0;
  result.m_backend.data._M_elems._104_5_ = 0;
  result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
  result.m_backend.exp = 0;
  result.m_backend.neg = false;
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)&result,RVar44);
  if ((((pUVar31->theval).m_backend.fpclass == cpp_dec_float_NaN) ||
      (result.m_backend.fpclass == cpp_dec_float_NaN)) ||
     (iVar21 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                         (&(pUVar31->theval).m_backend,&result.m_backend), iVar21 < 1)) {
    pUVar31 = pSVar32->theCoPvec;
    RVar44 = Tolerances::epsilon((pSVar32->
                                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 )._tolerances.
                                 super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr);
    result_11.m_backend.fpclass = cpp_dec_float_finite;
    result_11.m_backend.prec_elem = 0x1c;
    result_11.m_backend.data._M_elems[0] = 0;
    result_11.m_backend.data._M_elems[1] = 0;
    result_11.m_backend.data._M_elems[2] = 0;
    result_11.m_backend.data._M_elems[3] = 0;
    result_11.m_backend.data._M_elems[4] = 0;
    result_11.m_backend.data._M_elems[5] = 0;
    result_11.m_backend.data._M_elems[6] = 0;
    result_11.m_backend.data._M_elems[7] = 0;
    result_11.m_backend.data._M_elems[8] = 0;
    result_11.m_backend.data._M_elems[9] = 0;
    result_11.m_backend.data._M_elems[10] = 0;
    result_11.m_backend.data._M_elems[0xb] = 0;
    result_11.m_backend.data._M_elems[0xc] = 0;
    result_11.m_backend.data._M_elems[0xd] = 0;
    result_11.m_backend.data._M_elems[0xe] = 0;
    result_11.m_backend.data._M_elems[0xf] = 0;
    result_11.m_backend.data._M_elems[0x10] = 0;
    result_11.m_backend.data._M_elems[0x11] = 0;
    result_11.m_backend.data._M_elems[0x12] = 0;
    result_11.m_backend.data._M_elems[0x13] = 0;
    result_11.m_backend.data._M_elems[0x14] = 0;
    result_11.m_backend.data._M_elems[0x15] = 0;
    result_11.m_backend.data._M_elems[0x16] = 0;
    result_11.m_backend.data._M_elems[0x17] = 0;
    result_11.m_backend.data._M_elems[0x18] = 0;
    result_11.m_backend.data._M_elems[0x19] = 0;
    result_11.m_backend.data._M_elems._104_5_ = 0;
    result_11.m_backend.data._M_elems[0x1b]._1_3_ = 0;
    result_11.m_backend.exp = 0;
    result_11.m_backend.neg = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&result_11,RVar44);
    pcVar36 = (cpp_dec_float<200u,int,void> *)&result_11;
    pnVar34 = &leavebound;
    for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
      (pnVar34->m_backend).data._M_elems[0] = *(uint *)pcVar36;
      pcVar36 = pcVar36 + (ulong)bVar43 * -8 + 4;
      pnVar34 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar34 + ((ulong)bVar43 * -2 + 1) * 4);
    }
    leavebound.m_backend.exp = result_11.m_backend.exp;
    leavebound.m_backend.neg = result_11.m_backend.neg;
    leavebound.m_backend.fpclass = result_11.m_backend.fpclass;
    leavebound.m_backend.prec_elem = result_11.m_backend.prec_elem;
    if (leavebound.m_backend.data._M_elems[0] != 0 ||
        result_11.m_backend.fpclass != cpp_dec_float_finite) {
      leavebound.m_backend.neg = (bool)(result_11.m_backend.neg ^ 1);
    }
    if (((result_11.m_backend.fpclass != cpp_dec_float_NaN) &&
        ((pUVar31->theval).m_backend.fpclass != cpp_dec_float_NaN)) &&
       (iVar21 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                           (&(pUVar31->theval).m_backend,&leavebound.m_backend), iVar21 < 0))
    goto LAB_00513fef;
  }
  else {
LAB_00513fef:
    if (pSVar32->thePricing == FULL) {
      pUVar31 = pSVar32->theCoPvec;
      pUVar13 = pSVar32->thePvec;
      pnVar34 = &pUVar31->theval;
      pnVar40 = &pUVar13->theval;
      for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
        (pnVar40->m_backend).data._M_elems[0] = (pnVar34->m_backend).data._M_elems[0];
        pnVar34 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar34 + (ulong)bVar43 * -8 + 4);
        pnVar40 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar40 + (ulong)bVar43 * -8 + 4);
      }
      (pUVar13->theval).m_backend.exp = (pUVar31->theval).m_backend.exp;
      (pUVar13->theval).m_backend.neg = (pUVar31->theval).m_backend.neg;
      iVar18 = (pUVar31->theval).m_backend.prec_elem;
      (pUVar13->theval).m_backend.fpclass = (pUVar31->theval).m_backend.fpclass;
      (pUVar13->theval).m_backend.prec_elem = iVar18;
      (*(pSVar32->
        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[0x86])(pSVar32);
    }
    (*(pSVar32->
      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[0x87])(pSVar32);
  }
  leavebound.m_backend.fpclass = cpp_dec_float_finite;
  leavebound.m_backend.prec_elem = 0x1c;
  leavebound.m_backend.data._M_elems[0] = 0;
  leavebound.m_backend.data._M_elems[1] = 0;
  leavebound.m_backend.data._M_elems[2] = 0;
  leavebound.m_backend.data._M_elems[3] = 0;
  leavebound.m_backend.data._M_elems[4] = 0;
  leavebound.m_backend.data._M_elems[5] = 0;
  leavebound.m_backend.data._M_elems[6] = 0;
  leavebound.m_backend.data._M_elems[7] = 0;
  leavebound.m_backend.data._M_elems[8] = 0;
  leavebound.m_backend.data._M_elems[9] = 0;
  leavebound.m_backend.data._M_elems[10] = 0;
  leavebound.m_backend.data._M_elems[0xb] = 0;
  leavebound.m_backend.data._M_elems[0xc] = 0;
  leavebound.m_backend.data._M_elems[0xd] = 0;
  leavebound.m_backend.data._M_elems[0xe] = 0;
  leavebound.m_backend.data._M_elems[0xf] = 0;
  leavebound.m_backend.data._M_elems[0x10] = 0;
  leavebound.m_backend.data._M_elems[0x11] = 0;
  leavebound.m_backend.data._M_elems[0x12] = 0;
  leavebound.m_backend.data._M_elems[0x13] = 0;
  leavebound.m_backend.data._M_elems[0x14] = 0;
  leavebound.m_backend.data._M_elems[0x15] = 0;
  leavebound.m_backend.data._M_elems[0x16] = 0;
  leavebound.m_backend.data._M_elems[0x17] = 0;
  leavebound.m_backend.data._M_elems[0x18] = 0;
  leavebound.m_backend.data._M_elems[0x19] = 0;
  leavebound.m_backend.data._M_elems._104_5_ = 0;
  leavebound.m_backend.data._M_elems[0x1b]._1_3_ = 0;
  leavebound.m_backend.exp = 0;
  leavebound.m_backend.neg = false;
  pnVar34 = &enterMax;
  puVar37 = local_2b0;
  for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
    *puVar37 = (pnVar34->m_backend).data._M_elems[0];
    pnVar34 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar34 + ((ulong)bVar43 * -2 + 1) * 4);
    puVar37 = puVar37 + (ulong)bVar43 * -2 + 1;
  }
  local_240 = enterMax.m_backend.exp;
  local_23c = enterMax.m_backend.neg;
  local_238 = enterMax.m_backend.fpclass;
  iStack_234 = enterMax.m_backend.prec_elem;
  (*(pSVar32->
    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).
    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ._vptr_ClassArray[0x82])(pSVar32,(ulong)local_f7c,local_2b0,&leavebound,local_ba8);
  pnVar9 = (pSVar32->theUBbound).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pnVar34 = &enterUB;
  pnVar33 = pnVar9 + uVar29;
  for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
    (pnVar33->m_backend).data._M_elems[0] = (pnVar34->m_backend).data._M_elems[0];
    pnVar34 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar34 + ((ulong)bVar43 * -2 + 1) * 4);
    pnVar33 = (pointer)((long)pnVar33 + ((ulong)bVar43 * -2 + 1) * 4);
  }
  pnVar9[uVar29].m_backend.exp = enterUB.m_backend.exp;
  pnVar9[uVar29].m_backend.neg = enterUB.m_backend.neg;
  pnVar9[uVar29].m_backend.fpclass = enterUB.m_backend.fpclass;
  pnVar9[uVar29].m_backend.prec_elem = enterUB.m_backend.prec_elem;
  pnVar9 = (pSVar32->theLBbound).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pnVar34 = &enterLB;
  pnVar33 = pnVar9 + uVar29;
  for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
    (pnVar33->m_backend).data._M_elems[0] = (pnVar34->m_backend).data._M_elems[0];
    pnVar34 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar34 + ((ulong)bVar43 * -2 + 1) * 4);
    pnVar33 = (pointer)((long)pnVar33 + ((ulong)bVar43 * -2 + 1) * 4);
  }
  pnVar9[uVar29].m_backend.exp = enterLB.m_backend.exp;
  pnVar9[uVar29].m_backend.neg = enterLB.m_backend.neg;
  pnVar9[uVar29].m_backend.fpclass = enterLB.m_backend.fpclass;
  pnVar9[uVar29].m_backend.prec_elem = enterLB.m_backend.prec_elem;
  updateCoTest(pSVar32);
  if (pSVar32->thePricing == FULL) {
    updateTest(pSVar32);
  }
  pUVar31 = pSVar32->theFvec;
  pcVar35 = &result_1.m_backend;
  pnVar34 = &pUVar31->theval;
  for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
    (pnVar34->m_backend).data._M_elems[0] = (pcVar35->data)._M_elems[0];
    pcVar35 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar35 + (ulong)bVar43 * -8 + 4);
    pnVar34 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar34 + (ulong)bVar43 * -8 + 4);
  }
  (pUVar31->theval).m_backend.exp = result_1.m_backend.exp;
  (pUVar31->theval).m_backend.neg = result_1.m_backend.neg;
  (pUVar31->theval).m_backend.fpclass = result_1.m_backend.fpclass;
  (pUVar31->theval).m_backend.prec_elem = result_1.m_backend.prec_elem;
  pUVar31 = pSVar32->theFvec;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
  ::
  multAdd<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
            ((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
              *)pUVar31,&pUVar31->theval,&pUVar31->thedelta);
  result.m_backend.fpclass = cpp_dec_float_finite;
  result.m_backend.prec_elem = 0x1c;
  result.m_backend.exp = 0;
  result.m_backend.neg = false;
  pnVar34 = &enterVal;
  pcVar35 = &result.m_backend;
  for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
    (pcVar35->data)._M_elems[0] = (pnVar34->m_backend).data._M_elems[0];
    pnVar34 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar34 + ((ulong)bVar43 * -2 + 1) * 4);
    pcVar35 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar35 + (ulong)bVar43 * -8 + 4);
  }
  result.m_backend.exp = enterVal.m_backend.exp;
  result.m_backend.neg = enterVal.m_backend.neg;
  result.m_backend.fpclass = enterVal.m_backend.fpclass;
  result.m_backend.prec_elem = enterVal.m_backend.prec_elem;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
            (&result.m_backend,&result_1.m_backend);
  pnVar9 = (pSVar32->theFvec->
           super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pcVar35 = &result.m_backend;
  pnVar33 = pnVar9 + uVar29;
  for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
    *(uint *)&pnVar33->m_backend = (pcVar35->data)._M_elems[0];
    pcVar35 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar35 + (ulong)bVar43 * -8 + 4);
    pnVar33 = (pointer)((long)pnVar33 + ((ulong)bVar43 * -2 + 1) * 4);
  }
  pnVar9[uVar29].m_backend.exp = result.m_backend.exp;
  pnVar9[uVar29].m_backend.neg = result.m_backend.neg;
  pnVar9[uVar29].m_backend.fpclass = result.m_backend.fpclass;
  pnVar9[uVar29].m_backend.prec_elem = result.m_backend.prec_elem;
  RVar44 = Tolerances::epsilon((pSVar32->
                               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               )._tolerances.
                               super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr);
  result.m_backend.fpclass = cpp_dec_float_finite;
  result.m_backend.prec_elem = 0x1c;
  result.m_backend.data._M_elems._0_16_ = ZEXT816(0);
  result.m_backend.data._M_elems._16_16_ = ZEXT816(0);
  result.m_backend.data._M_elems._32_16_ = ZEXT816(0);
  result.m_backend.data._M_elems._48_16_ = ZEXT816(0);
  result.m_backend.data._M_elems._64_16_ = ZEXT816(0);
  result.m_backend.data._M_elems._80_16_ = ZEXT816(0);
  result.m_backend.data._M_elems[0x18] = 0;
  result.m_backend.data._M_elems[0x19] = 0;
  result.m_backend.data._M_elems._104_5_ = 0;
  result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
  result.m_backend.exp = 0;
  result.m_backend.neg = false;
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)&result.m_backend,RVar44);
  if (((leavebound.m_backend.fpclass == cpp_dec_float_NaN) ||
      (result.m_backend.fpclass == cpp_dec_float_NaN)) ||
     (iVar21 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                         (&leavebound.m_backend,&result.m_backend), iVar21 < 1)) {
    RVar44 = Tolerances::epsilon((pSVar32->
                                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 )._tolerances.
                                 super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr);
    local_8b0._0_4_ = cpp_dec_float_finite;
    local_8b0._4_4_ = 0x1c;
    local_928 = 0;
    uStack_920 = 0;
    local_918 = 0;
    uStack_910 = 0;
    local_908 = 0;
    uStack_900 = 0;
    local_8f8 = 0;
    uStack_8f0 = 0;
    local_8e8 = 0;
    uStack_8e0 = 0;
    local_8d8 = 0;
    uStack_8d0 = 0;
    local_8c8 = 0;
    uStack_8c0 = 0;
    uStack_8bb = 0;
    iStack_8b8 = 0;
    bStack_8b4 = 0;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&local_928,RVar44);
    pcVar36 = (cpp_dec_float<200u,int,void> *)&local_928;
    pnVar34 = &result_11;
    for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
      (pnVar34->m_backend).data._M_elems[0] = *(uint *)pcVar36;
      pcVar36 = pcVar36 + (ulong)bVar43 * -8 + 4;
      pnVar34 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar34 + ((ulong)bVar43 * -2 + 1) * 4);
    }
    result_11.m_backend.exp = iStack_8b8;
    result_11.m_backend.neg = (bool)bStack_8b4;
    result_11.m_backend.fpclass = (fpclass_type)local_8b0;
    result_11.m_backend.prec_elem = local_8b0._4_4_;
    if (result_11.m_backend.data._M_elems[0] != 0 || (fpclass_type)local_8b0 != cpp_dec_float_finite
       ) {
      result_11.m_backend.neg = (bool)(bStack_8b4 ^ 1);
    }
    if ((((fpclass_type)local_8b0 != cpp_dec_float_NaN) &&
        (leavebound.m_backend.fpclass != cpp_dec_float_NaN)) &&
       (iVar21 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                           (&leavebound.m_backend,&result_11.m_backend), iVar21 < 0))
    goto LAB_00514397;
  }
  else {
LAB_00514397:
    pVVar14 = pSVar32->theFrhs;
    pnVar34 = &leavebound;
    pcVar35 = &result_11.m_backend;
    for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
      (((cpp_dec_float<200U,_int,_void> *)&pcVar35->data)->data)._M_elems[0] =
           (pnVar34->m_backend).data._M_elems[0];
      pnVar34 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar34 + ((ulong)bVar43 * -2 + 1) * 4);
      pcVar35 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar35 + (ulong)bVar43 * -8 + 4);
    }
    result_11.m_backend.exp = leavebound.m_backend.exp;
    result_11.m_backend.neg = leavebound.m_backend.neg;
    result_11.m_backend.fpclass = leavebound.m_backend.fpclass;
    result_11.m_backend.prec_elem = leavebound.m_backend.prec_elem;
    if (leavebound.m_backend.fpclass != cpp_dec_float_finite ||
        result_11.m_backend.data._M_elems[0] != 0) {
      result_11.m_backend.neg = (bool)(leavebound.m_backend.neg ^ 1);
    }
    pSVar15 = (pSVar32->
              super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).matrix.data[local_f88];
    lVar26 = (long)pSVar15->memused;
    pSVar32 = local_f98;
    if (0 < lVar26) {
      lVar27 = lVar26 + 1;
      lVar26 = lVar26 * 0x84;
      do {
        pcVar25 = (cpp_dec_float<200U,_int,_void> *)
                  ((long)pSVar15->m_elem[-1].val.m_backend.data._M_elems + lVar26);
        result.m_backend.fpclass = cpp_dec_float_finite;
        result.m_backend.prec_elem = 0x1c;
        result.m_backend.data._M_elems[0] = 0;
        result.m_backend.data._M_elems[1] = 0;
        result.m_backend.data._M_elems[2] = 0;
        result.m_backend.data._M_elems[3] = 0;
        result.m_backend.data._M_elems[4] = 0;
        result.m_backend.data._M_elems[5] = 0;
        result.m_backend.data._M_elems[6] = 0;
        result.m_backend.data._M_elems[7] = 0;
        result.m_backend.data._M_elems[8] = 0;
        result.m_backend.data._M_elems[9] = 0;
        result.m_backend.data._M_elems[10] = 0;
        result.m_backend.data._M_elems[0xb] = 0;
        result.m_backend.data._M_elems[0xc] = 0;
        result.m_backend.data._M_elems[0xd] = 0;
        result.m_backend.data._M_elems[0xe] = 0;
        result.m_backend.data._M_elems[0xf] = 0;
        result.m_backend.data._M_elems[0x10] = 0;
        result.m_backend.data._M_elems[0x11] = 0;
        result.m_backend.data._M_elems[0x12] = 0;
        result.m_backend.data._M_elems[0x13] = 0;
        result.m_backend.data._M_elems[0x14] = 0;
        result.m_backend.data._M_elems[0x15] = 0;
        result.m_backend.data._M_elems[0x16] = 0;
        result.m_backend.data._M_elems[0x17] = 0;
        result.m_backend.data._M_elems[0x18] = 0;
        result.m_backend.data._M_elems[0x19] = 0;
        result.m_backend.data._M_elems._104_5_ = 0;
        result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
        result.m_backend.exp = 0;
        result.m_backend.neg = false;
        pcVar35 = &result_11.m_backend;
        if (pcVar25 != &result.m_backend) {
          pcVar39 = &result.m_backend;
          for (lVar28 = 0x1c; lVar28 != 0; lVar28 = lVar28 + -1) {
            (pcVar39->data)._M_elems[0] =
                 (((cpp_dec_float<200U,_int,_void> *)&pcVar35->data)->data)._M_elems[0];
            pcVar35 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar35 + (ulong)bVar43 * -8 + 4);
            pcVar39 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar39 + (ulong)bVar43 * -8 + 4);
          }
          result.m_backend.exp = result_11.m_backend.exp;
          result.m_backend.neg = result_11.m_backend.neg;
          result.m_backend.fpclass = result_11.m_backend.fpclass;
          result.m_backend.prec_elem = result_11.m_backend.prec_elem;
          pcVar35 = pcVar25;
        }
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                  (&result.m_backend,pcVar35);
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                  (&(pVVar14->val).
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start
                    [*(int *)((long)(&pSVar15->m_elem[-1].val + 1) + lVar26)].m_backend,
                   &result.m_backend);
        lVar27 = lVar27 + -1;
        pSVar32 = local_f98;
        lVar26 = lVar26 + -0x84;
      } while (1 < lVar27);
    }
  }
  RVar44 = Tolerances::epsilon((pSVar32->
                               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               )._tolerances.
                               super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr);
  result.m_backend.fpclass = cpp_dec_float_finite;
  result.m_backend.prec_elem = 0x1c;
  result.m_backend.data._M_elems._0_16_ = ZEXT816(0);
  result.m_backend.data._M_elems._16_16_ = ZEXT816(0);
  result.m_backend.data._M_elems._32_16_ = ZEXT816(0);
  result.m_backend.data._M_elems._48_16_ = ZEXT816(0);
  result.m_backend.data._M_elems._64_16_ = ZEXT816(0);
  result.m_backend.data._M_elems._80_16_ = ZEXT816(0);
  result.m_backend.data._M_elems[0x18] = 0;
  result.m_backend.data._M_elems[0x19] = 0;
  result.m_backend.data._M_elems._104_5_ = 0;
  result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
  result.m_backend.exp = 0;
  result.m_backend.neg = false;
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)&result.m_backend,RVar44);
  if (((enterVal.m_backend.fpclass == cpp_dec_float_NaN) ||
      (result.m_backend.fpclass == cpp_dec_float_NaN)) ||
     (iVar21 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                         (&enterVal.m_backend,&result.m_backend), iVar21 < 1)) {
    RVar44 = Tolerances::epsilon((pSVar32->
                                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 )._tolerances.
                                 super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr);
    local_8b0._0_4_ = cpp_dec_float_finite;
    local_8b0._4_4_ = 0x1c;
    local_928 = 0;
    uStack_920 = 0;
    local_918 = 0;
    uStack_910 = 0;
    local_908 = 0;
    uStack_900 = 0;
    local_8f8 = 0;
    uStack_8f0 = 0;
    local_8e8 = 0;
    uStack_8e0 = 0;
    local_8d8 = 0;
    uStack_8d0 = 0;
    local_8c8 = 0;
    uStack_8c0 = 0;
    uStack_8bb = 0;
    iStack_8b8 = 0;
    bStack_8b4 = 0;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&local_928,RVar44);
    pcVar36 = (cpp_dec_float<200u,int,void> *)&local_928;
    pnVar34 = &result_11;
    for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
      (pnVar34->m_backend).data._M_elems[0] = *(uint *)pcVar36;
      pcVar36 = pcVar36 + (ulong)bVar43 * -8 + 4;
      pnVar34 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar34 + ((ulong)bVar43 * -2 + 1) * 4);
    }
    result_11.m_backend.exp = iStack_8b8;
    result_11.m_backend.neg = (bool)bStack_8b4;
    result_11.m_backend.fpclass = (fpclass_type)local_8b0;
    result_11.m_backend.prec_elem = local_8b0._4_4_;
    if (result_11.m_backend.data._M_elems[0] != 0 || (fpclass_type)local_8b0 != cpp_dec_float_finite
       ) {
      result_11.m_backend.neg = (bool)(bStack_8b4 ^ 1);
    }
    if ((((fpclass_type)local_8b0 == cpp_dec_float_NaN) ||
        (enterVal.m_backend.fpclass == cpp_dec_float_NaN)) ||
       (iVar21 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                           (&enterVal.m_backend,&result_11.m_backend), -1 < iVar21))
    goto LAB_00514746;
  }
  lVar26 = (long)rhs->memused;
  if (0 < lVar26) {
    pVVar14 = pSVar32->theFrhs;
    lVar27 = lVar26 + 1;
    lVar26 = lVar26 * 0x84;
    do {
      pcVar25 = (cpp_dec_float<200U,_int,_void> *)
                ((long)rhs->m_elem[-1].val.m_backend.data._M_elems + lVar26);
      result.m_backend.fpclass = cpp_dec_float_finite;
      result.m_backend.prec_elem = 0x1c;
      result.m_backend.data._M_elems[0] = 0;
      result.m_backend.data._M_elems[1] = 0;
      result.m_backend.data._M_elems[2] = 0;
      result.m_backend.data._M_elems[3] = 0;
      result.m_backend.data._M_elems[4] = 0;
      result.m_backend.data._M_elems[5] = 0;
      result.m_backend.data._M_elems[6] = 0;
      result.m_backend.data._M_elems[7] = 0;
      result.m_backend.data._M_elems[8] = 0;
      result.m_backend.data._M_elems[9] = 0;
      result.m_backend.data._M_elems[10] = 0;
      result.m_backend.data._M_elems[0xb] = 0;
      result.m_backend.data._M_elems[0xc] = 0;
      result.m_backend.data._M_elems[0xd] = 0;
      result.m_backend.data._M_elems[0xe] = 0;
      result.m_backend.data._M_elems[0xf] = 0;
      result.m_backend.data._M_elems[0x10] = 0;
      result.m_backend.data._M_elems[0x11] = 0;
      result.m_backend.data._M_elems[0x12] = 0;
      result.m_backend.data._M_elems[0x13] = 0;
      result.m_backend.data._M_elems[0x14] = 0;
      result.m_backend.data._M_elems[0x15] = 0;
      result.m_backend.data._M_elems[0x16] = 0;
      result.m_backend.data._M_elems[0x17] = 0;
      result.m_backend.data._M_elems[0x18] = 0;
      result.m_backend.data._M_elems[0x19] = 0;
      result.m_backend.data._M_elems._104_5_ = 0;
      result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      result.m_backend.exp = 0;
      result.m_backend.neg = false;
      pcVar35 = &enterVal.m_backend;
      if (pcVar25 != &result.m_backend) {
        pcVar39 = &result.m_backend;
        for (lVar28 = 0x1c; lVar28 != 0; lVar28 = lVar28 + -1) {
          (pcVar39->data)._M_elems[0] =
               (((cpp_dec_float<200U,_int,_void> *)&pcVar35->data)->data)._M_elems[0];
          pcVar35 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar35 + (ulong)bVar43 * -8 + 4);
          pcVar39 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar39 + (ulong)bVar43 * -8 + 4);
        }
        result.m_backend.exp = enterVal.m_backend.exp;
        result.m_backend.neg = enterVal.m_backend.neg;
        result.m_backend.fpclass = enterVal.m_backend.fpclass;
        result.m_backend.prec_elem = enterVal.m_backend.prec_elem;
        pcVar35 = pcVar25;
      }
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                (&result.m_backend,pcVar35);
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                (&(pVVar14->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start
                  [*(int *)((long)(&rhs->m_elem[-1].val + 1) + lVar26)].m_backend,&result.m_backend)
      ;
      lVar27 = lVar27 + -1;
      lVar26 = lVar26 + -0x84;
    } while (1 < lVar27);
  }
LAB_00514746:
  puVar37 = (uint *)local_ba8;
  pnVar34 = local_3b0;
  for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
    (pnVar34->m_backend).data._M_elems[0] = *puVar37;
    puVar37 = puVar37 + (ulong)bVar43 * -2 + 1;
    pnVar34 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar34 + ((ulong)bVar43 * -2 + 1) * 4);
  }
  local_3b0[0].m_backend.exp = iStack_b38;
  local_3b0[0].m_backend.neg = (bool)uStack_b34;
  local_3b0[0].m_backend.fpclass = (fpclass_type)local_b30;
  local_3b0[0].m_backend.prec_elem = local_b30._4_4_;
  updateNonbasicValue(pSVar32,local_3b0);
  (**(pSVar32->
     super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
     )._vptr_SPxBasisBase)
            (&pSVar32->
              super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ,(ulong)local_f7c,local_f90,rhs,&pSVar32->theFvec->thedelta);
  return bVar42;
}

Assistant:

bool SPxSolverBase<R>::enter(SPxId& enterId, bool polish)
{
   assert(enterId.isValid());
   assert(type() == ENTER);
   assert(initialized);

   SPxId none;          // invalid id used when enter fails
   R enterTest;      // correct test value of entering var
   R enterUB;        // upper bound of entering variable
   R enterLB;        // lower bound of entering variable
   R enterVal;       // current value of entering variable
   R enterMax;       // maximum value for entering shift
   R enterPric;      // priced value of entering variable
   typename SPxBasisBase<R>::Desc::Status enterStat;      // status of entering variable
   R enterRO;        // rhs/obj of entering variable
   StableSum<R> objChange;
   const SVectorBase<R>* enterVec = enterVector(enterId);

   bool instable = instableEnter;
   assert(!instable || instableEnterId.isValid());

   getEnterVals(enterId, enterTest, enterUB, enterLB,
                enterVal, enterMax, enterPric, enterStat, enterRO, objChange);

   if(!polish && enterTest > -epsilon())
   {
      rejectEnter(enterId, enterTest, enterStat);
      this->change(-1, none, nullptr);

      SPxOut::debug(this, "DENTER08 rejecting false enter pivot\n");

      return false;
   }

   /*  Before performing the actual basis update, we must determine, how this
       is to be accomplished.
   */
   // BH 2005-11-15: Obviously solve4update() is only called if theFvec.delta()
   // is setup (i.e. the indices of the NZEs are stored within it) and there are
   // 0 NZEs (???).
   // In that case theFvec->delta() is set such that
   //   Base * theFvec->delta() = enterVec
   if(theFvec->delta().isSetup() && theFvec->delta().size() == 0)
      SPxBasisBase<R>::solve4update(theFvec->delta(), *enterVec);

#ifdef ENABLE_ADDITIONAL_CHECKS
   else
   {
      // BH 2005-11-29: This code block seems to check the assertion
      //   || Base * theFvec->delta() - enterVec ||_2 <= entertol()
      VectorBase<R> tmp(dim());
      // BH 2005-11-15: This cast is necessary since SSVectorBase<R>  inherits protected from VectorBase<R>.
      tmp = reinterpret_cast<VectorBase<R>&>(theFvec->delta());
      this->multBaseWith(tmp);
      tmp -= *enterVec;

      if(tmp.length() > entertol())
      {
         // This happens frequently and does usually not hurt, so print these
         // warnings only with verbose level INFO2 and higher.
         SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "WENTER09 fVec updated error = "
                       << tmp.length() << std::endl;)
      }
   }

#endif  // ENABLE_ADDITIONAL_CHECKS

   if(!polish && m_numCycle > m_maxCycle)
   {
      if(-enterMax > 0)
         perturbMaxEnter();
      else
         perturbMinEnter();
   }

   R leaveVal = -enterMax;

   boundflips = 0;
   int leaveIdx = theratiotester->selectLeave(leaveVal, enterTest, polish);

   /* in row representation, fixed columns and rows should not leave the basis */
   assert(leaveIdx < 0 || !this->baseId(leaveIdx).isSPxColId()
          || this->desc().colStatus(this->number(SPxColId(this->baseId(leaveIdx)))) !=
          SPxBasisBase<R>::Desc::P_FIXED);
   assert(leaveIdx < 0 || !this->baseId(leaveIdx).isSPxRowId()
          || this->desc().rowStatus(this->number(SPxRowId(this->baseId(leaveIdx)))) !=
          SPxBasisBase<R>::Desc::P_FIXED);

   instableEnterVal = 0;
   instableEnterId = SPxId();
   instableEnter = false;

   /*
     We now tried to find a variable to leave the basis. If one has been
     found, a regular basis update is to be performed.
   */
   if(leaveIdx >= 0)
   {
      if(spxAbs(leaveVal) < entertol())
      {
         if(NE(theUBbound[leaveIdx], theLBbound[leaveIdx], this->tolerances()->epsilon())
               && enterStat != SPxBasisBase<R>::Desc::P_FREE && enterStat != SPxBasisBase<R>::Desc::D_FREE)
         {
            m_numCycle++;
            enterCycles++;
         }
      }
      else
         m_numCycle /= 2;

      // setup for updating the copricing vector
      if(coSolveVector3 && coSolveVector2)
      {
         assert(coSolveVector2->isConsistent());
         assert(coSolveVector2rhs->isSetup());
         assert(coSolveVector3->isConsistent());
         assert(coSolveVector3rhs->isSetup());
         assert(boundflips > 0);
         SPxBasisBase<R>::coSolve(theCoPvec->delta(), *coSolveVector2, *coSolveVector3
                                  , unitVecs[leaveIdx], *coSolveVector2rhs, *coSolveVector3rhs);
         (*theCoPvec) -= (*coSolveVector3);
      }
      else if(coSolveVector3)
      {
         assert(coSolveVector3->isConsistent());
         assert(coSolveVector3rhs->isSetup());
         assert(boundflips > 0);
         SPxBasisBase<R>::coSolve(theCoPvec->delta(), *coSolveVector3, unitVecs[leaveIdx],
                                  *coSolveVector3rhs);
         (*theCoPvec) -= (*coSolveVector3);
      }
      else if(coSolveVector2)
         SPxBasisBase<R>::coSolve(theCoPvec->delta(), *coSolveVector2, unitVecs[leaveIdx],
                                  *coSolveVector2rhs);
      else
         SPxBasisBase<R>::coSolve(theCoPvec->delta(), unitVecs[leaveIdx]);

      if(boundflips > 0)
      {
         for(int i = coSolveVector3->dim() - 1; i >= 0; --i)
         {
            if(spxAbs((*coSolveVector3)[i]) > epsilon())
               (*thePvec).multAdd(-(*coSolveVector3)[i], (*thecovectors)[i]);
         }

         // we need to update enterPric in case it was changed by bound flips
         if(enterId.isSPxColId())
            enterPric = (*theCoPvec)[this->number(SPxColId(enterId))];
         else
            enterPric = (*thePvec)[this->number(SPxRowId(enterId))];

         SPxOut::debug(this, "IEBFRT02 breakpoints passed / bounds flipped = {}\n", boundflips);
         totalboundflips += boundflips;
      }

      (*theCoPrhs)[leaveIdx] = enterRO;
      theCoPvec->value() = (enterRO - enterPric) / theFvec->delta()[leaveIdx];

      if(theCoPvec->value() > epsilon() || theCoPvec->value() < -epsilon())
      {
         if(pricing() == FULL)
         {
            thePvec->value() = theCoPvec->value();
            setupPupdate();
         }

         doPupdate();
      }

      assert(thePvec->isConsistent());
      assert(theCoPvec->isConsistent());

      assert(!this->baseId(leaveIdx).isSPxRowId()
             || this->desc().rowStatus(this->number(SPxRowId(this->baseId(leaveIdx)))) !=
             SPxBasisBase<R>::Desc::P_FIXED);
      assert(!this->baseId(leaveIdx).isSPxColId()
             || this->desc().colStatus(this->number(SPxColId(this->baseId(leaveIdx)))) !=
             SPxBasisBase<R>::Desc::P_FIXED);

      R leavebound;             // bound on which leaving variable moves

      try
      {
         getEnterVals2(leaveIdx, enterMax, leavebound, objChange);
      }
      catch(const SPxException& F)
      {
         rejectEnter(enterId, enterTest, enterStat);
         this->change(-1, none, nullptr);
         throw F;
      }

      //  process entering variable
      theUBbound[leaveIdx] = enterUB;
      theLBbound[leaveIdx] = enterLB;

      //  compute tests:
      updateCoTest();

      if(pricing() == FULL)
         updateTest();

      // update feasibility vectors
      theFvec->value() = leaveVal;
      theFvec->update();
      (*theFvec)[leaveIdx] = enterVal - leaveVal;

      if(leavebound > epsilon() || leavebound < -epsilon())
         theFrhs->multAdd(-leavebound, this->baseVec(leaveIdx));

      if(enterVal > epsilon() || enterVal < -epsilon())
         theFrhs->multAdd(enterVal, *enterVec);

      // update objective funtion value
      updateNonbasicValue(objChange);

      //  change basis matrix
      this->change(leaveIdx, enterId, enterVec, &(theFvec->delta()));

      return true;
   }
   /*  No leaving vector could be found that would yield a stable pivot step.
    */
   else if(NE(leaveVal, -enterMax, this->tolerances()->epsilon()))
   {
      /* In the ENTER algorithm, when for a selected entering variable we find only
         an instable leaving variable, then the basis change is not conducted.
         Instead, we save the entering variable's id in instableEnterId and set
         the test value to zero, hoping to find a different leaving
         variable with a stable leavingvariable.
         If this fails, however, and no more entering variable is found, we have to
         perform the instable basis change using instableEnterId. In this (and only
         in this) case, the flag instableEnter is set to true.

         leaveVal != enterMax is the case that selectLeave has found only an instable leaving
         variable. We store this leaving variable for later if we are not already in the
         instable case */

      if(!instable)
      {
         instableEnterId = enterId;
         instableEnterVal = enterTest;

         SPxOut::debug(this, "DENTER09 rejecting enter pivot and looking for others\n");

         rejectEnter(enterId, enterTest / 10.0, enterStat);
         this->change(-1, none, nullptr);
      }
      else
      {
         SPxOut::debug(this, "DENTER10 rejecting enter pivot in instable state, resetting values\n");
         rejectEnter(enterId, enterTest, enterStat);
         this->change(-1, none, nullptr);
      }

      return false;
   }
   /*  No leaving vector has been selected from the basis. However, if the
       shift amount for |fVec| is bounded, we are in the case, that the
       entering variable is moved from one bound to its other, before any of
       the basis feasibility variables reaches their bound. This may only
       happen in primal/columnwise case with upper and lower bounds on
       variables.
   */
   else if(!polish && leaveVal < R(infinity) && leaveVal > R(-infinity))
   {
      assert(rep() == COLUMN);
      assert(EQ(leaveVal, -enterMax, this->epsilon()));

      this->change(-1, enterId, enterVec);

      theFvec->value() = leaveVal;
      theFvec->update();

      ungetEnterVal(enterId, enterStat, leaveVal, *enterVec, objChange);

      // update objective funtion value
      updateNonbasicValue(objChange);

      SPxOut::debug(this, "DENTER11 moving entering variable from one bound to the other\n");

      return false;
   }
   /*  No variable could be selected to leave the basis and even the entering
       variable is unbounded --- this is a failure.
   */
   else
   {
      /* The following line originally was in the "lastUpdate() > 1" case;
         we need it in the INFEASIBLE/UNBOUNDED case, too, to have the
         basis descriptor at the correct size.
      */
      rejectEnter(enterId, enterTest, enterStat);
      this->change(-1, none, nullptr);

      if(polish)
         return false;

      else if(this->lastUpdate() > 1)
      {
         SPX_MSG_INFO3((*this->spxout), (*this->spxout) << "IENTER01 factorization triggered in "
                       << "enter() for feasibility test" << std::endl;)

         try
         {
            factorize();
         }
         catch(const SPxStatusException& E)
         {
            // don't exit immediately but handle the singularity correctly
            assert(SPxBasisBase<R>::status() == SPxBasisBase<R>::SINGULAR);
            SPX_MSG_INFO3((*this->spxout),
                          (*this->spxout) << "Caught exception in factorization: " << E.what() <<
                          std::endl;)
         }

         /* after a factorization, the entering column/row might not be infeasible or suboptimal anymore, hence we do
          * not try to call leave(leaveIdx), but rather return to the main solving loop and call the pricer again
          */
         return false;
      }

      /* do not exit with status infeasible or unbounded if there is only a very small violation
       * ROW: recompute the primal variables and activities for another, more precise, round of pricing
       */
      else if(spxAbs(enterTest) < entertol())
      {
         SPX_MSG_INFO3((*this->spxout),
                       (*this->spxout) << "IENTER11 clean up step to reduce numerical errors" <<
                       std::endl;)

         SPxBasisBase<R>::coSolve(*theCoPvec, *theCoPrhs);
         computePvec();
         computeCoTest();
         computeTest();

         return false;
      }

      SPX_MSG_INFO3((*this->spxout), (*this->spxout) << "IENTER02 unboundedness/infeasibility found in "
                    << "enter()" << std::endl;)

      if(rep() == ROW)
      {
         computeDualfarkas4Row(leaveVal, enterId);
         setBasisStatus(SPxBasisBase<R>::INFEASIBLE);
      }
      /**@todo if shift() is not zero, we must not conclude primal unboundedness */
      else
      {
         computePrimalray4Col(leaveVal, enterId);
         setBasisStatus(SPxBasisBase<R>::UNBOUNDED);
      }

      return false;
   }
}